

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  __int_type_conflict _Var14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  Geometry *pGVar72;
  uint uVar73;
  Geometry *geometry;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long lVar74;
  byte bVar75;
  ulong uVar76;
  float fVar77;
  float fVar78;
  float fVar123;
  float fVar124;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar84 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar126;
  float fVar129;
  float fVar130;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar131;
  float fVar132;
  undefined4 uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar139;
  undefined1 auVar138 [32];
  undefined1 auVar141 [16];
  undefined8 uVar140;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar163;
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_600 [16];
  ulong local_5e8;
  Geometry *local_5e0;
  Precalculations *local_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  LinearSpace3fa *local_490;
  Primitive *local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined8 local_3a0;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar178 [64];
  
  PVar12 = prim[1];
  uVar76 = (ulong)(byte)PVar12;
  lVar23 = uVar76 * 0x25;
  fVar149 = *(float *)(prim + lVar23 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar82 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + lVar23 + 6));
  fVar148 = fVar149 * auVar83._0_4_;
  fVar131 = fVar149 * auVar82._0_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar81);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar76 * 0xf + 6);
  auVar90 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar94 = vpmovsxbd_avx2(auVar7);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92 = vcvtdq2ps_avx(auVar94);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar76 + 6);
  auVar93 = vpmovsxbd_avx2(auVar8);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 * 0x1a + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 0x1b + 6);
  auVar99 = vpmovsxbd_avx2(auVar10);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 * 0x1c + 6);
  auVar87 = vpmovsxbd_avx2(auVar11);
  auVar95 = vcvtdq2ps_avx(auVar87);
  auVar160._4_4_ = fVar131;
  auVar160._0_4_ = fVar131;
  auVar160._8_4_ = fVar131;
  auVar160._12_4_ = fVar131;
  auVar160._16_4_ = fVar131;
  auVar160._20_4_ = fVar131;
  auVar160._24_4_ = fVar131;
  auVar160._28_4_ = fVar131;
  auVar180._8_4_ = 1;
  auVar180._0_8_ = 0x100000001;
  auVar180._12_4_ = 1;
  auVar180._16_4_ = 1;
  auVar180._20_4_ = 1;
  auVar180._24_4_ = 1;
  auVar180._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = ZEXT1632(CONCAT412(fVar149 * auVar82._12_4_,
                               CONCAT48(fVar149 * auVar82._8_4_,
                                        CONCAT44(fVar149 * auVar82._4_4_,fVar131))));
  auVar96 = vpermps_avx2(auVar180,auVar97);
  auVar86 = vpermps_avx512vl(auVar85,auVar97);
  fVar132 = auVar86._0_4_;
  fVar139 = auVar86._4_4_;
  auVar97._4_4_ = fVar139 * auVar89._4_4_;
  auVar97._0_4_ = fVar132 * auVar89._0_4_;
  fVar161 = auVar86._8_4_;
  auVar97._8_4_ = fVar161 * auVar89._8_4_;
  fVar163 = auVar86._12_4_;
  auVar97._12_4_ = fVar163 * auVar89._12_4_;
  fVar77 = auVar86._16_4_;
  auVar97._16_4_ = fVar77 * auVar89._16_4_;
  fVar78 = auVar86._20_4_;
  auVar97._20_4_ = fVar78 * auVar89._20_4_;
  fVar123 = auVar86._24_4_;
  auVar97._24_4_ = fVar123 * auVar89._24_4_;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar93._4_4_ * fVar139;
  auVar94._0_4_ = auVar93._0_4_ * fVar132;
  auVar94._8_4_ = auVar93._8_4_ * fVar161;
  auVar94._12_4_ = auVar93._12_4_ * fVar163;
  auVar94._16_4_ = auVar93._16_4_ * fVar77;
  auVar94._20_4_ = auVar93._20_4_ * fVar78;
  auVar94._24_4_ = auVar93._24_4_ * fVar123;
  auVar94._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar95._4_4_ * fVar139;
  auVar87._0_4_ = auVar95._0_4_ * fVar132;
  auVar87._8_4_ = auVar95._8_4_ * fVar161;
  auVar87._12_4_ = auVar95._12_4_ * fVar163;
  auVar87._16_4_ = auVar95._16_4_ * fVar77;
  auVar87._20_4_ = auVar95._20_4_ * fVar78;
  auVar87._24_4_ = auVar95._24_4_ * fVar123;
  auVar87._28_4_ = auVar86._28_4_;
  auVar79 = vfmadd231ps_fma(auVar97,auVar96,auVar88);
  auVar80 = vfmadd231ps_fma(auVar94,auVar96,auVar92);
  auVar81 = vfmadd231ps_fma(auVar87,auVar99,auVar96);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar160,auVar91);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar160,auVar90);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar100,auVar160);
  auVar175._4_4_ = fVar148;
  auVar175._0_4_ = fVar148;
  auVar175._8_4_ = fVar148;
  auVar175._12_4_ = fVar148;
  auVar175._16_4_ = fVar148;
  auVar175._20_4_ = fVar148;
  auVar175._24_4_ = fVar148;
  auVar175._28_4_ = fVar148;
  auVar87 = ZEXT1632(CONCAT412(fVar149 * auVar83._12_4_,
                               CONCAT48(fVar149 * auVar83._8_4_,
                                        CONCAT44(fVar149 * auVar83._4_4_,fVar148))));
  auVar94 = vpermps_avx2(auVar180,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar149 = auVar87._0_4_;
  fVar132 = auVar87._4_4_;
  auVar96._4_4_ = fVar132 * auVar89._4_4_;
  auVar96._0_4_ = fVar149 * auVar89._0_4_;
  fVar139 = auVar87._8_4_;
  auVar96._8_4_ = fVar139 * auVar89._8_4_;
  fVar161 = auVar87._12_4_;
  auVar96._12_4_ = fVar161 * auVar89._12_4_;
  fVar163 = auVar87._16_4_;
  auVar96._16_4_ = fVar163 * auVar89._16_4_;
  fVar77 = auVar87._20_4_;
  auVar96._20_4_ = fVar77 * auVar89._20_4_;
  fVar78 = auVar87._24_4_;
  auVar96._24_4_ = fVar78 * auVar89._24_4_;
  auVar96._28_4_ = fVar131;
  auVar85._4_4_ = auVar93._4_4_ * fVar132;
  auVar85._0_4_ = auVar93._0_4_ * fVar149;
  auVar85._8_4_ = auVar93._8_4_ * fVar139;
  auVar85._12_4_ = auVar93._12_4_ * fVar161;
  auVar85._16_4_ = auVar93._16_4_ * fVar163;
  auVar85._20_4_ = auVar93._20_4_ * fVar77;
  auVar85._24_4_ = auVar93._24_4_ * fVar78;
  auVar85._28_4_ = auVar89._28_4_;
  auVar93._4_4_ = auVar95._4_4_ * fVar132;
  auVar93._0_4_ = auVar95._0_4_ * fVar149;
  auVar93._8_4_ = auVar95._8_4_ * fVar139;
  auVar93._12_4_ = auVar95._12_4_ * fVar161;
  auVar93._16_4_ = auVar95._16_4_ * fVar163;
  auVar93._20_4_ = auVar95._20_4_ * fVar77;
  auVar93._24_4_ = auVar95._24_4_ * fVar78;
  auVar93._28_4_ = auVar87._28_4_;
  auVar6 = vfmadd231ps_fma(auVar96,auVar94,auVar88);
  auVar7 = vfmadd231ps_fma(auVar85,auVar94,auVar92);
  auVar8 = vfmadd231ps_fma(auVar93,auVar94,auVar99);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar175,auVar91);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar175,auVar90);
  auVar167._8_4_ = 0x7fffffff;
  auVar167._0_8_ = 0x7fffffff7fffffff;
  auVar167._12_4_ = 0x7fffffff;
  auVar167._16_4_ = 0x7fffffff;
  auVar167._20_4_ = 0x7fffffff;
  auVar167._24_4_ = 0x7fffffff;
  auVar167._28_4_ = 0x7fffffff;
  auVar141 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar175,auVar100);
  auVar91 = vandps_avx(auVar167,ZEXT1632(auVar79));
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar16 = (bool)((byte)uVar68 & 1);
  auVar86._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar79._0_4_;
  bVar16 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar79._4_4_;
  bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar79._8_4_;
  bVar16 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar79._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(auVar167,ZEXT1632(auVar80));
  uVar68 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar16 = (bool)((byte)uVar68 & 1);
  auVar98._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar80._0_4_;
  bVar16 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar80._4_4_;
  bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar80._8_4_;
  bVar16 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar80._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(auVar167,ZEXT1632(auVar81));
  uVar68 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar16 = (bool)((byte)uVar68 & 1);
  auVar91._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar81._0_4_;
  bVar16 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar81._4_4_;
  bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar81._8_4_;
  bVar16 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar81._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar90 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
  auVar79 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar98);
  auVar90 = vfnmadd213ps_avx512vl(auVar98,auVar88,auVar89);
  auVar80 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar91);
  auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
  auVar81 = vfmadd132ps_fma(auVar91,auVar88,auVar88);
  fVar149 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  auVar162._4_4_ = fVar149;
  auVar162._0_4_ = fVar149;
  auVar162._8_4_ = fVar149;
  auVar162._12_4_ = fVar149;
  auVar162._16_4_ = fVar149;
  auVar162._20_4_ = fVar149;
  auVar162._24_4_ = fVar149;
  auVar162._28_4_ = fVar149;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xb + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xd + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar7 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x12 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar68 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 2 + uVar68 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar8 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x18 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar9 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1d + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar10 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar76) + 6))
  ;
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x23 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar11 = vfmadd213ps_fma(auVar88,auVar162,auVar91);
  auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar82));
  auVar100._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar100._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar100._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar100._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar100._16_4_ = auVar91._16_4_ * 0.0;
  auVar100._20_4_ = auVar91._20_4_ * 0.0;
  auVar100._24_4_ = auVar91._24_4_ * 0.0;
  auVar100._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar82));
  auVar146._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar146._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar146._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar146._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar146._16_4_ = auVar91._16_4_ * 0.0;
  auVar146._20_4_ = auVar91._20_4_ * 0.0;
  auVar146._24_4_ = auVar91._24_4_ * 0.0;
  auVar146._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
  auVar99._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar99._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar99._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar99._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar99._16_4_ = auVar91._16_4_ * 0.0;
  auVar99._20_4_ = auVar91._20_4_ * 0.0;
  auVar99._24_4_ = auVar91._24_4_ * 0.0;
  auVar99._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar83));
  auVar142._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar142._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar142._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar142._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar142._16_4_ = auVar91._16_4_ * 0.0;
  auVar142._20_4_ = auVar91._20_4_ * 0.0;
  auVar142._24_4_ = auVar91._24_4_ * 0.0;
  auVar142._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar141));
  auVar95._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar95._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar95._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar95._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar141));
  auVar112._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar112._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar112._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar112._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar112._16_4_ = auVar91._16_4_ * 0.0;
  auVar112._20_4_ = auVar91._20_4_ * 0.0;
  auVar112._24_4_ = auVar91._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar100,auVar146);
  auVar88 = vpminsd_avx2(auVar99,auVar142);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88 = vpminsd_avx2(auVar95,auVar112);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar89._4_4_ = uVar133;
  auVar89._0_4_ = uVar133;
  auVar89._8_4_ = uVar133;
  auVar89._12_4_ = uVar133;
  auVar89._16_4_ = uVar133;
  auVar89._20_4_ = uVar133;
  auVar89._24_4_ = uVar133;
  auVar89._28_4_ = uVar133;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar91,auVar88);
  auVar91 = vpmaxsd_avx2(auVar100,auVar146);
  auVar88 = vpmaxsd_avx2(auVar99,auVar142);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar88 = vpmaxsd_avx2(auVar95,auVar112);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar133;
  auVar90._0_4_ = uVar133;
  auVar90._8_4_ = uVar133;
  auVar90._12_4_ = uVar133;
  auVar90._16_4_ = uVar133;
  auVar90._20_4_ = uVar133;
  auVar90._24_4_ = uVar133;
  auVar90._28_4_ = uVar133;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar88 = vpbroadcastd_avx512vl();
  uVar22 = vpcmpgtd_avx512vl(auVar88,_DAT_01fe9900);
  uVar140 = vcmpps_avx512vl(local_80,auVar91,2);
  if ((byte)((byte)uVar140 & (byte)uVar22) == 0) {
    bVar75 = 0;
  }
  else {
    uVar68 = (ulong)(byte)((byte)uVar140 & (byte)uVar22);
    local_490 = pre->ray_space + k;
    local_3c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5d8 = pre;
    local_488 = prim;
    do {
      lVar23 = 0;
      for (uVar76 = uVar68; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_5e8 = (ulong)*(uint *)(local_488 + 2);
      pGVar72 = (context->scene->geometries).items[local_5e8].ptr;
      local_540._0_8_ = CONCAT44(0,*(uint *)(local_488 + lVar23 * 4 + 6));
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar72->field_0x58 +
                               CONCAT44(0,*(uint *)(local_488 + lVar23 * 4 + 6)) *
                               pGVar72[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar149 = (pGVar72->time_range).lower;
      fVar149 = pGVar72->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar149) /
                ((pGVar72->time_range).upper - fVar149));
      auVar79 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
      auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar72->fnumTimeSegments + -1.0)));
      auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
      fVar149 = fVar149 - auVar79._0_4_;
      _Var14 = pGVar72[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar69 = (long)(int)auVar79._0_4_ * 0x38;
      lVar23 = *(long *)(_Var14 + 0x10 + lVar69);
      lVar74 = *(long *)(_Var14 + 0x38 + lVar69);
      lVar67 = *(long *)(_Var14 + 0x48 + lVar69);
      auVar83._4_4_ = fVar149;
      auVar83._0_4_ = fVar149;
      auVar83._8_4_ = fVar149;
      auVar83._12_4_ = fVar149;
      pfVar3 = (float *)(lVar74 + uVar76 * lVar67);
      auVar166._0_4_ = fVar149 * *pfVar3;
      auVar166._4_4_ = fVar149 * pfVar3[1];
      auVar166._8_4_ = fVar149 * pfVar3[2];
      auVar166._12_4_ = fVar149 * pfVar3[3];
      pfVar3 = (float *)(lVar74 + (uVar76 + 1) * lVar67);
      auVar169._0_4_ = fVar149 * *pfVar3;
      auVar169._4_4_ = fVar149 * pfVar3[1];
      auVar169._8_4_ = fVar149 * pfVar3[2];
      auVar169._12_4_ = fVar149 * pfVar3[3];
      uVar70 = (uVar76 + 2) * lVar67;
      auVar79 = vmulps_avx512vl(auVar83,*(undefined1 (*) [16])(lVar74 + uVar70));
      auVar80 = vmulps_avx512vl(auVar83,*(undefined1 (*) [16])(lVar74 + lVar67 * (uVar76 + 3)));
      lVar74 = *(long *)(_Var14 + lVar69);
      fVar149 = 1.0 - fVar149;
      auVar82._4_4_ = fVar149;
      auVar82._0_4_ = fVar149;
      auVar82._8_4_ = fVar149;
      auVar82._12_4_ = fVar149;
      local_510 = vfmadd231ps_fma(auVar166,auVar82,*(undefined1 (*) [16])(lVar74 + lVar23 * uVar76))
      ;
      local_520 = vfmadd231ps_fma(auVar169,auVar82,
                                  *(undefined1 (*) [16])(lVar74 + lVar23 * (uVar76 + 1)));
      local_530 = vfmadd231ps_avx512vl
                            (auVar79,auVar82,*(undefined1 (*) [16])(lVar74 + lVar23 * (uVar76 + 2)))
      ;
      _local_3b0 = vfmadd231ps_avx512vl
                             (auVar80,auVar82,*(undefined1 (*) [16])(lVar74 + lVar23 * (uVar76 + 3))
                             );
      iVar13 = (int)pGVar72[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar23 = (long)iVar13 * 0x44;
      auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar81 = vsubps_avx(local_510,auVar79);
      uVar133 = auVar81._0_4_;
      auVar84._4_4_ = uVar133;
      auVar84._0_4_ = uVar133;
      auVar84._8_4_ = uVar133;
      auVar84._12_4_ = uVar133;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      aVar4 = (local_490->vx).field_0;
      aVar5 = (local_490->vy).field_0;
      fVar149 = (local_490->vz).field_0.m128[0];
      fVar131 = *(float *)((long)&(local_490->vz).field_0 + 4);
      fVar132 = *(float *)((long)&(local_490->vz).field_0 + 8);
      fVar139 = *(float *)((long)&(local_490->vz).field_0 + 0xc);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar171._0_4_ = fVar149 * auVar81._0_4_;
      auVar171._4_4_ = fVar131 * auVar81._4_4_;
      auVar171._8_4_ = fVar132 * auVar81._8_4_;
      auVar171._12_4_ = fVar139 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar80);
      auVar6 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar84);
      auVar81 = vsubps_avx(local_520,auVar79);
      uVar133 = auVar81._0_4_;
      auVar144._4_4_ = uVar133;
      auVar144._0_4_ = uVar133;
      auVar144._8_4_ = uVar133;
      auVar144._12_4_ = uVar133;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar172._0_4_ = fVar149 * auVar81._0_4_;
      auVar172._4_4_ = fVar131 * auVar81._4_4_;
      auVar172._8_4_ = fVar132 * auVar81._8_4_;
      auVar172._12_4_ = fVar139 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar5,auVar80);
      auVar7 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar144);
      auVar81 = vsubps_avx512vl(local_530,auVar79);
      uVar133 = auVar81._0_4_;
      auVar145._4_4_ = uVar133;
      auVar145._0_4_ = uVar133;
      auVar145._8_4_ = uVar133;
      auVar145._12_4_ = uVar133;
      auVar80 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar173._0_4_ = fVar149 * auVar81._0_4_;
      auVar173._4_4_ = fVar131 * auVar81._4_4_;
      auVar173._8_4_ = fVar132 * auVar81._8_4_;
      auVar173._12_4_ = fVar139 * auVar81._12_4_;
      auVar80 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar80);
      auVar81 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar145);
      auVar80 = vsubps_avx512vl(_local_3b0,auVar79);
      uVar133 = auVar80._0_4_;
      auVar141._4_4_ = uVar133;
      auVar141._0_4_ = uVar133;
      auVar141._8_4_ = uVar133;
      auVar141._12_4_ = uVar133;
      auVar79 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar179._0_4_ = fVar149 * auVar80._0_4_;
      auVar179._4_4_ = fVar131 * auVar80._4_4_;
      auVar179._8_4_ = fVar132 * auVar80._8_4_;
      auVar179._12_4_ = fVar139 * auVar80._12_4_;
      auVar79 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar79);
      auVar8 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar141);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar133 = auVar6._0_4_;
      local_420._4_4_ = uVar133;
      local_420._0_4_ = uVar133;
      local_420._8_4_ = uVar133;
      local_420._12_4_ = uVar133;
      local_420._16_4_ = uVar133;
      local_420._20_4_ = uVar133;
      local_420._24_4_ = uVar133;
      local_420._28_4_ = uVar133;
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      auVar138._8_4_ = 1;
      auVar138._0_8_ = 0x100000001;
      auVar138._12_4_ = 1;
      auVar138._16_4_ = 1;
      auVar138._20_4_ = 1;
      auVar138._24_4_ = 1;
      auVar138._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar138,ZEXT1632(auVar6));
      local_440 = vbroadcastss_avx512vl(auVar7);
      local_580 = vpermps_avx2(auVar138,ZEXT1632(auVar7));
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_5a0 = vbroadcastss_avx512vl(auVar81);
      local_500 = vpermps_avx512vl(auVar138,ZEXT1632(auVar81));
      auVar190 = ZEXT3264(local_500);
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0xd8c);
      local_4c0 = vbroadcastss_avx512vl(auVar8);
      auVar193 = ZEXT3264(local_4c0);
      local_4e0 = vpermps_avx512vl(auVar138,ZEXT1632(auVar8));
      auVar192 = ZEXT3264(local_4e0);
      auVar92 = vmulps_avx512vl(local_4c0,auVar90);
      auVar93 = vmulps_avx512vl(local_4e0,auVar90);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_5a0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_500);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_440);
      auVar79 = vfmadd231ps_fma(auVar93,auVar88,local_580);
      auVar94 = vfmadd231ps_avx512vl(auVar92,auVar91,local_420);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,local_3e0);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0xd8c);
      auVar95 = vmulps_avx512vl(local_4c0,auVar99);
      auVar96 = vmulps_avx512vl(local_4e0,auVar99);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_5a0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_500);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_440);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_580);
      auVar9 = vfmadd231ps_fma(auVar95,auVar92,local_420);
      auVar10 = vfmadd231ps_fma(auVar96,auVar92,local_3e0);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar9),auVar94);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar10),auVar87);
      auVar95 = vmulps_avx512vl(auVar87,auVar96);
      auVar85 = vmulps_avx512vl(auVar94,auVar97);
      auVar95 = vsubps_avx512vl(auVar95,auVar85);
      auVar79 = vshufps_avx(local_510,local_510,0xff);
      uVar140 = auVar79._0_8_;
      local_a0._8_8_ = uVar140;
      local_a0._0_8_ = uVar140;
      local_a0._16_8_ = uVar140;
      local_a0._24_8_ = uVar140;
      auVar79 = vshufps_avx(local_520,local_520,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(local_530,local_530,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(_local_3b0,_local_3b0,0xff);
      uVar140 = auVar79._0_8_;
      register0x000012c8 = uVar140;
      local_100 = uVar140;
      register0x000012d0 = uVar140;
      register0x000012d8 = uVar140;
      auVar85 = vmulps_avx512vl(_local_100,auVar90);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,local_e0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,local_c0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_a0);
      auVar86 = vmulps_avx512vl(_local_100,auVar99);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_e0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,local_c0);
      auVar11 = vfmadd231ps_fma(auVar86,auVar92,local_a0);
      auVar86 = vmulps_avx512vl(auVar97,auVar97);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar96,auVar96);
      auVar98 = vmaxps_avx512vl(auVar85,ZEXT1632(auVar11));
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      auVar86 = vmulps_avx512vl(auVar98,auVar86);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      uVar140 = vcmpps_avx512vl(auVar95,auVar86,2);
      auVar79 = vblendps_avx(auVar6,local_510,8);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar80 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar7,local_520,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar79);
      auVar79 = vblendps_avx(auVar81,local_530,8);
      auVar83 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar8,_local_3b0,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vmaxps_avx(auVar83,auVar79);
      auVar79 = vmaxps_avx(auVar80,auVar79);
      auVar80 = vmovshdup_avx(auVar79);
      auVar80 = vmaxss_avx(auVar80,auVar79);
      auVar79 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vmaxss_avx(auVar79,auVar80);
      local_550 = vcvtsi2ss_avx512f(local_530,iVar13);
      auVar168._0_4_ = local_550._0_4_;
      auVar168._4_4_ = auVar168._0_4_;
      auVar168._8_4_ = auVar168._0_4_;
      auVar168._12_4_ = auVar168._0_4_;
      auVar168._16_4_ = auVar168._0_4_;
      auVar168._20_4_ = auVar168._0_4_;
      auVar168._24_4_ = auVar168._0_4_;
      auVar168._28_4_ = auVar168._0_4_;
      uVar22 = vcmpps_avx512vl(auVar168,_DAT_01faff40,0xe);
      bVar75 = (byte)uVar140 & (byte)uVar22;
      auVar79 = vmulss_avx512f(auVar79,ZEXT416(0x35000000));
      auVar147._8_4_ = 2;
      auVar147._0_8_ = 0x200000002;
      auVar147._12_4_ = 2;
      auVar147._16_4_ = 2;
      auVar147._20_4_ = 2;
      auVar147._24_4_ = 2;
      auVar147._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar147,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar147,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar147,ZEXT1632(auVar81));
      auVar95 = vpermps_avx2(auVar147,ZEXT1632(auVar8));
      uVar73 = *(uint *)(ray + k * 4 + 0x30);
      local_2c0 = auVar79._0_4_;
      uStack_2bc = auVar79._4_4_;
      uStack_2b8 = auVar79._8_4_;
      uStack_2b4 = auVar79._12_4_;
      auVar80 = auVar97._0_16_;
      if (bVar75 == 0) {
        uVar70 = 0;
        auVar79 = vxorps_avx512vl(auVar80,auVar80);
        auVar189 = ZEXT1664(auVar79);
        auVar186 = ZEXT3264(local_420);
        auVar187 = ZEXT3264(local_3e0);
        auVar188 = ZEXT3264(local_440);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar191 = ZEXT3264(auVar91);
        auVar185 = ZEXT3264(local_580);
        auVar184 = ZEXT3264(local_5a0);
      }
      else {
        local_480._0_16_ = ZEXT416(uVar73);
        auVar99 = vmulps_avx512vl(auVar95,auVar99);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar100);
        auVar93 = vfmadd213ps_avx512vl(auVar92,local_120,auVar93);
        auVar90 = vmulps_avx512vl(auVar95,auVar90);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_160,auVar90);
        auVar100 = vfmadd213ps_avx512vl(auVar88,local_140,auVar89);
        auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1f9c);
        auVar100 = vfmadd213ps_avx512vl(auVar91,local_120,auVar100);
        auVar91 = vmulps_avx512vl(local_4c0,auVar92);
        auVar99 = vmulps_avx512vl(local_4e0,auVar92);
        auVar174._0_4_ = auVar95._0_4_ * auVar92._0_4_;
        auVar174._4_4_ = auVar95._4_4_ * auVar92._4_4_;
        auVar174._8_4_ = auVar95._8_4_ * auVar92._8_4_;
        auVar174._12_4_ = auVar95._12_4_ * auVar92._12_4_;
        auVar174._16_4_ = auVar95._16_4_ * auVar92._16_4_;
        auVar174._20_4_ = auVar95._20_4_ * auVar92._20_4_;
        auVar174._24_4_ = auVar95._24_4_ * auVar92._24_4_;
        auVar174._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar90,local_5a0);
        auVar92 = vfmadd231ps_avx512vl(auVar99,auVar90,local_500);
        auVar90 = vfmadd231ps_avx512vl(auVar174,local_160,auVar90);
        auVar81 = vfmadd231ps_fma(auVar91,auVar89,local_440);
        auVar185 = ZEXT3264(local_580);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar89,local_580);
        auVar92 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,local_420);
        auVar86 = vfmadd231ps_avx512vl(auVar91,auVar88,local_3e0);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_120,auVar88);
        auVar88 = vmulps_avx512vl(local_4c0,auVar90);
        auVar98 = vmulps_avx512vl(local_4e0,auVar90);
        auVar29._4_4_ = auVar95._4_4_ * auVar90._4_4_;
        auVar29._0_4_ = auVar95._0_4_ * auVar90._0_4_;
        auVar29._8_4_ = auVar95._8_4_ * auVar90._8_4_;
        auVar29._12_4_ = auVar95._12_4_ * auVar90._12_4_;
        auVar29._16_4_ = auVar95._16_4_ * auVar90._16_4_;
        auVar29._20_4_ = auVar95._20_4_ * auVar90._20_4_;
        auVar29._24_4_ = auVar95._24_4_ * auVar90._24_4_;
        auVar29._28_4_ = auVar90._28_4_;
        auVar90 = vfmadd231ps_avx512vl(auVar88,auVar89,local_5a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_500);
        auVar89 = vfmadd231ps_avx512vl(auVar29,local_160,auVar89);
        auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_440);
        auVar188 = ZEXT3264(local_440);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_580);
        auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
        auVar89 = vfmadd231ps_avx512vl(auVar90,auVar91,local_420);
        auVar90 = vfmadd231ps_avx512vl(auVar98,auVar91,local_3e0);
        auVar98 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
        auVar181._8_4_ = 0x7fffffff;
        auVar181._0_8_ = 0x7fffffff7fffffff;
        auVar181._12_4_ = 0x7fffffff;
        auVar181._16_4_ = 0x7fffffff;
        auVar181._20_4_ = 0x7fffffff;
        auVar181._24_4_ = 0x7fffffff;
        auVar181._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(auVar99,auVar181);
        auVar88 = vandps_avx(auVar86,auVar181);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar92,auVar181);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        auVar92 = vbroadcastss_avx512vl(auVar79);
        uVar76 = vcmpps_avx512vl(auVar91,auVar92,1);
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar101._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar99._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar99._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar99._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar99._12_4_);
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar99._16_4_);
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar99._20_4_);
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar99._24_4_);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar101._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar99._28_4_;
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar102._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar86._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar86._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar86._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar86._12_4_);
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar86._16_4_);
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar86._20_4_);
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar86._24_4_);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar102._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar86._28_4_;
        auVar91 = vandps_avx(auVar181,auVar89);
        auVar88 = vandps_avx(auVar90,auVar181);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar98,auVar181);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        uVar76 = vcmpps_avx512vl(auVar91,auVar92,1);
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar103._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar89._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar89._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar89._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar89._12_4_);
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar89._16_4_);
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar89._20_4_);
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar89._24_4_);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar103._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar89._28_4_;
        bVar16 = (bool)((byte)uVar76 & 1);
        auVar104._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar90._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar90._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar90._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar90._12_4_);
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar90._16_4_);
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar90._20_4_);
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar90._24_4_);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar104._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar90._28_4_;
        auVar84 = vxorps_avx512vl(auVar80,auVar80);
        auVar189 = ZEXT1664(auVar84);
        auVar91 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar84));
        auVar79 = vfmadd231ps_fma(auVar91,auVar102,auVar102);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar149 = auVar91._0_4_;
        fVar131 = auVar91._4_4_;
        fVar132 = auVar91._8_4_;
        fVar139 = auVar91._12_4_;
        fVar161 = auVar91._16_4_;
        fVar163 = auVar91._20_4_;
        fVar77 = auVar91._24_4_;
        auVar30._4_4_ = fVar131 * fVar131 * fVar131 * auVar79._4_4_ * -0.5;
        auVar30._0_4_ = fVar149 * fVar149 * fVar149 * auVar79._0_4_ * -0.5;
        auVar30._8_4_ = fVar132 * fVar132 * fVar132 * auVar79._8_4_ * -0.5;
        auVar30._12_4_ = fVar139 * fVar139 * fVar139 * auVar79._12_4_ * -0.5;
        auVar30._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar30._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar30._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
        auVar30._28_4_ = auVar98._28_4_;
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar91 = vfmadd231ps_avx512vl(auVar30,auVar88,auVar91);
        auVar31._4_4_ = auVar102._4_4_ * auVar91._4_4_;
        auVar31._0_4_ = auVar102._0_4_ * auVar91._0_4_;
        auVar31._8_4_ = auVar102._8_4_ * auVar91._8_4_;
        auVar31._12_4_ = auVar102._12_4_ * auVar91._12_4_;
        auVar31._16_4_ = auVar102._16_4_ * auVar91._16_4_;
        auVar31._20_4_ = auVar102._20_4_ * auVar91._20_4_;
        auVar31._24_4_ = auVar102._24_4_ * auVar91._24_4_;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = auVar91._4_4_ * -auVar101._4_4_;
        auVar32._0_4_ = auVar91._0_4_ * -auVar101._0_4_;
        auVar32._8_4_ = auVar91._8_4_ * -auVar101._8_4_;
        auVar32._12_4_ = auVar91._12_4_ * -auVar101._12_4_;
        auVar32._16_4_ = auVar91._16_4_ * -auVar101._16_4_;
        auVar32._20_4_ = auVar91._20_4_ * -auVar101._20_4_;
        auVar32._24_4_ = auVar91._24_4_ * -auVar101._24_4_;
        auVar32._28_4_ = auVar102._28_4_;
        auVar91 = vmulps_avx512vl(auVar91,ZEXT1632(auVar84));
        auVar96 = ZEXT1632(auVar84);
        auVar89 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar96);
        auVar79 = vfmadd231ps_fma(auVar89,auVar104,auVar104);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar149 = auVar89._0_4_;
        fVar131 = auVar89._4_4_;
        fVar132 = auVar89._8_4_;
        fVar139 = auVar89._12_4_;
        fVar161 = auVar89._16_4_;
        fVar163 = auVar89._20_4_;
        fVar77 = auVar89._24_4_;
        auVar33._4_4_ = fVar131 * fVar131 * fVar131 * auVar79._4_4_ * -0.5;
        auVar33._0_4_ = fVar149 * fVar149 * fVar149 * auVar79._0_4_ * -0.5;
        auVar33._8_4_ = fVar132 * fVar132 * fVar132 * auVar79._8_4_ * -0.5;
        auVar33._12_4_ = fVar139 * fVar139 * fVar139 * auVar79._12_4_ * -0.5;
        auVar33._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar33._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar33._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
        auVar33._28_4_ = 0;
        auVar88 = vfmadd231ps_avx512vl(auVar33,auVar88,auVar89);
        auVar34._4_4_ = auVar104._4_4_ * auVar88._4_4_;
        auVar34._0_4_ = auVar104._0_4_ * auVar88._0_4_;
        auVar34._8_4_ = auVar104._8_4_ * auVar88._8_4_;
        auVar34._12_4_ = auVar104._12_4_ * auVar88._12_4_;
        auVar34._16_4_ = auVar104._16_4_ * auVar88._16_4_;
        auVar34._20_4_ = auVar104._20_4_ * auVar88._20_4_;
        auVar34._24_4_ = auVar104._24_4_ * auVar88._24_4_;
        auVar34._28_4_ = auVar89._28_4_;
        auVar35._4_4_ = -auVar103._4_4_ * auVar88._4_4_;
        auVar35._0_4_ = -auVar103._0_4_ * auVar88._0_4_;
        auVar35._8_4_ = -auVar103._8_4_ * auVar88._8_4_;
        auVar35._12_4_ = -auVar103._12_4_ * auVar88._12_4_;
        auVar35._16_4_ = -auVar103._16_4_ * auVar88._16_4_;
        auVar35._20_4_ = -auVar103._20_4_ * auVar88._20_4_;
        auVar35._24_4_ = -auVar103._24_4_ * auVar88._24_4_;
        auVar35._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar88 = vmulps_avx512vl(auVar88,auVar96);
        auVar79 = vfmadd213ps_fma(auVar31,auVar85,auVar94);
        auVar80 = vfmadd213ps_fma(auVar32,auVar85,auVar87);
        auVar89 = vfmadd213ps_avx512vl(auVar91,auVar85,auVar100);
        auVar90 = vfmadd213ps_avx512vl(auVar34,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar82 = vfnmadd213ps_fma(auVar31,auVar85,auVar94);
        auVar99 = ZEXT1632(auVar11);
        auVar81 = vfmadd213ps_fma(auVar35,auVar99,ZEXT1632(auVar10));
        auVar83 = vfnmadd213ps_fma(auVar32,auVar85,auVar87);
        auVar6 = vfmadd213ps_fma(auVar88,auVar99,auVar93);
        auVar92 = vfnmadd231ps_avx512vl(auVar100,auVar85,auVar91);
        auVar9 = vfnmadd213ps_fma(auVar34,auVar99,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar35,auVar99,ZEXT1632(auVar10));
        auVar141 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar11),auVar88);
        auVar88 = vsubps_avx512vl(auVar90,ZEXT1632(auVar82));
        auVar91 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar83));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar6),auVar92);
        auVar100 = vmulps_avx512vl(auVar91,auVar92);
        auVar7 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar83),auVar93);
        auVar36._4_4_ = auVar82._4_4_ * auVar93._4_4_;
        auVar36._0_4_ = auVar82._0_4_ * auVar93._0_4_;
        auVar36._8_4_ = auVar82._8_4_ * auVar93._8_4_;
        auVar36._12_4_ = auVar82._12_4_ * auVar93._12_4_;
        auVar36._16_4_ = auVar93._16_4_ * 0.0;
        auVar36._20_4_ = auVar93._20_4_ * 0.0;
        auVar36._24_4_ = auVar93._24_4_ * 0.0;
        auVar36._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar36,auVar92,auVar88);
        auVar37._4_4_ = auVar83._4_4_ * auVar88._4_4_;
        auVar37._0_4_ = auVar83._0_4_ * auVar88._0_4_;
        auVar37._8_4_ = auVar83._8_4_ * auVar88._8_4_;
        auVar37._12_4_ = auVar83._12_4_ * auVar88._12_4_;
        auVar37._16_4_ = auVar88._16_4_ * 0.0;
        auVar37._20_4_ = auVar88._20_4_ * 0.0;
        auVar37._24_4_ = auVar88._24_4_ * 0.0;
        auVar37._28_4_ = auVar88._28_4_;
        auVar8 = vfmsub231ps_fma(auVar37,ZEXT1632(auVar82),auVar91);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar96,auVar93);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,ZEXT1632(auVar7));
        auVar97 = ZEXT1632(auVar84);
        uVar76 = vcmpps_avx512vl(auVar91,auVar97,2);
        bVar66 = (byte)uVar76;
        fVar77 = (float)((uint)(bVar66 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar9._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar123 = (float)((uint)bVar16 * auVar79._4_4_ | (uint)!bVar16 * auVar9._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar124 = (float)((uint)bVar16 * auVar79._8_4_ | (uint)!bVar16 * auVar9._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar127 = (float)((uint)bVar16 * auVar79._12_4_ | (uint)!bVar16 * auVar9._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar123,fVar77))));
        fVar78 = (float)((uint)(bVar66 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar10._0_4_);
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar148 = (float)((uint)bVar16 * auVar80._4_4_ | (uint)!bVar16 * auVar10._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar125 = (float)((uint)bVar16 * auVar80._8_4_ | (uint)!bVar16 * auVar10._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar128 = (float)((uint)bVar16 * auVar80._12_4_ | (uint)!bVar16 * auVar10._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar148,fVar78))));
        auVar105._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar141._0_4_
                    );
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar141._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar141._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar141._12_4_);
        fVar149 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar89._16_4_);
        auVar105._16_4_ = fVar149;
        fVar131 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar89._20_4_);
        auVar105._20_4_ = fVar131;
        fVar132 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar89._24_4_);
        auVar105._24_4_ = fVar132;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar89._28_4_;
        auVar105._28_4_ = iVar1;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar90);
        auVar106._0_4_ =
             (uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar7._0_4_;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar7._4_4_;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar7._8_4_;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar7._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar88._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar88._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar88._24_4_;
        auVar106._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar81));
        auVar107._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar80._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar80._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar80._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar80._12_4_);
        fVar139 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar88._16_4_);
        auVar107._16_4_ = fVar139;
        fVar161 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar88._20_4_);
        auVar107._20_4_ = fVar161;
        fVar163 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar88._24_4_);
        auVar107._24_4_ = fVar163;
        auVar107._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(auVar92,ZEXT1632(auVar6));
        auVar108._0_4_ =
             (float)((uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar89._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar89._4_4_);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar89._8_4_);
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar89._12_4_);
        bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * auVar89._16_4_);
        bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar16 * auVar88._20_4_ | (uint)!bVar16 * auVar89._20_4_);
        bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar16 * auVar88._24_4_ | (uint)!bVar16 * auVar89._24_4_);
        bVar16 = SUB81(uVar76 >> 7,0);
        auVar108._28_4_ = (uint)bVar16 * auVar88._28_4_ | (uint)!bVar16 * auVar89._28_4_;
        auVar109._0_4_ =
             (uint)(bVar66 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar90._0_4_;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar16 * (int)auVar82._4_4_ | (uint)!bVar16 * auVar90._4_4_;
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar16 * (int)auVar82._8_4_ | (uint)!bVar16 * auVar90._8_4_;
        bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar16 * (int)auVar82._12_4_ | (uint)!bVar16 * auVar90._12_4_;
        auVar109._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar90._16_4_;
        auVar109._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar90._20_4_;
        auVar109._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar90._24_4_;
        auVar109._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar90._28_4_;
        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar110._0_4_ =
             (uint)(bVar66 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar6._0_4_;
        bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar17 * auVar92._4_4_ | (uint)!bVar17 * auVar6._4_4_;
        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar17 * auVar92._8_4_ | (uint)!bVar17 * auVar6._8_4_;
        bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar17 * auVar92._12_4_ | (uint)!bVar17 * auVar6._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar92._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar92._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar92._24_4_;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar92._28_4_;
        auVar110._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar109,auVar100);
        auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar83._12_4_ |
                                                (uint)!bVar19 * auVar81._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar83._8_4_ |
                                                         (uint)!bVar18 * auVar81._8_4_,
                                                         CONCAT44((uint)bVar16 * (int)auVar83._4_4_
                                                                  | (uint)!bVar16 * auVar81._4_4_,
                                                                  (uint)(bVar66 & 1) *
                                                                  (int)auVar83._0_4_ |
                                                                  (uint)!(bool)(bVar66 & 1) *
                                                                  auVar81._0_4_)))),auVar99);
        auVar89 = vsubps_avx(auVar110,auVar105);
        auVar90 = vsubps_avx(auVar100,auVar106);
        auVar92 = vsubps_avx(auVar99,auVar107);
        auVar93 = vsubps_avx(auVar105,auVar108);
        auVar38._4_4_ = auVar89._4_4_ * fVar123;
        auVar38._0_4_ = auVar89._0_4_ * fVar77;
        auVar38._8_4_ = auVar89._8_4_ * fVar124;
        auVar38._12_4_ = auVar89._12_4_ * fVar127;
        auVar38._16_4_ = auVar89._16_4_ * 0.0;
        auVar38._20_4_ = auVar89._20_4_ * 0.0;
        auVar38._24_4_ = auVar89._24_4_ * 0.0;
        auVar38._28_4_ = iVar2;
        auVar79 = vfmsub231ps_fma(auVar38,auVar105,auVar94);
        auVar39._4_4_ = fVar148 * auVar94._4_4_;
        auVar39._0_4_ = fVar78 * auVar94._0_4_;
        auVar39._8_4_ = fVar125 * auVar94._8_4_;
        auVar39._12_4_ = fVar128 * auVar94._12_4_;
        auVar39._16_4_ = auVar94._16_4_ * 0.0;
        auVar39._20_4_ = auVar94._20_4_ * 0.0;
        auVar39._24_4_ = auVar94._24_4_ * 0.0;
        auVar39._28_4_ = auVar91._28_4_;
        auVar80 = vfmsub231ps_fma(auVar39,auVar100,auVar88);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar97,ZEXT1632(auVar79));
        auVar154._0_4_ = auVar88._0_4_ * auVar105._0_4_;
        auVar154._4_4_ = auVar88._4_4_ * auVar105._4_4_;
        auVar154._8_4_ = auVar88._8_4_ * auVar105._8_4_;
        auVar154._12_4_ = auVar88._12_4_ * auVar105._12_4_;
        auVar154._16_4_ = auVar88._16_4_ * fVar149;
        auVar154._20_4_ = auVar88._20_4_ * fVar131;
        auVar154._24_4_ = auVar88._24_4_ * fVar132;
        auVar154._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar154,auVar99,auVar89);
        auVar87 = vfmadd231ps_avx512vl(auVar91,auVar97,ZEXT1632(auVar79));
        auVar91 = vmulps_avx512vl(auVar93,auVar106);
        auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar108);
        auVar40._4_4_ = auVar92._4_4_ * auVar108._4_4_;
        auVar40._0_4_ = auVar92._0_4_ * auVar108._0_4_;
        auVar40._8_4_ = auVar92._8_4_ * auVar108._8_4_;
        auVar40._12_4_ = auVar92._12_4_ * auVar108._12_4_;
        auVar40._16_4_ = auVar92._16_4_ * auVar108._16_4_;
        auVar40._20_4_ = auVar92._20_4_ * auVar108._20_4_;
        auVar40._24_4_ = auVar92._24_4_ * auVar108._24_4_;
        auVar40._28_4_ = auVar108._28_4_;
        auVar79 = vfmsub231ps_fma(auVar40,auVar107,auVar93);
        auVar155._0_4_ = auVar107._0_4_ * auVar90._0_4_;
        auVar155._4_4_ = auVar107._4_4_ * auVar90._4_4_;
        auVar155._8_4_ = auVar107._8_4_ * auVar90._8_4_;
        auVar155._12_4_ = auVar107._12_4_ * auVar90._12_4_;
        auVar155._16_4_ = fVar139 * auVar90._16_4_;
        auVar155._20_4_ = fVar161 * auVar90._20_4_;
        auVar155._24_4_ = fVar163 * auVar90._24_4_;
        auVar155._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar155,auVar92,auVar106);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar97,auVar91);
        auVar96 = vfmadd231ps_avx512vl(auVar91,auVar97,ZEXT1632(auVar79));
        auVar91 = vmaxps_avx(auVar87,auVar96);
        uVar140 = vcmpps_avx512vl(auVar91,auVar97,2);
        bVar75 = bVar75 & (byte)uVar140;
        auVar186 = ZEXT3264(local_420);
        auVar187 = ZEXT3264(local_3e0);
        auVar184 = ZEXT3264(local_5a0);
        if (bVar75 == 0) {
          uVar70 = 0;
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar191 = ZEXT3264(auVar91);
          auVar190 = ZEXT3264(local_500);
          auVar193 = ZEXT3264(local_4c0);
          auVar192 = ZEXT3264(local_4e0);
        }
        else {
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar176._4_4_ = uVar133;
          auVar176._0_4_ = uVar133;
          auVar176._8_4_ = uVar133;
          auVar176._12_4_ = uVar133;
          auVar176._16_4_ = uVar133;
          auVar176._20_4_ = uVar133;
          auVar176._24_4_ = uVar133;
          auVar176._28_4_ = uVar133;
          auVar178 = ZEXT3264(auVar176);
          auVar41._4_4_ = auVar93._4_4_ * auVar88._4_4_;
          auVar41._0_4_ = auVar93._0_4_ * auVar88._0_4_;
          auVar41._8_4_ = auVar93._8_4_ * auVar88._8_4_;
          auVar41._12_4_ = auVar93._12_4_ * auVar88._12_4_;
          auVar41._16_4_ = auVar93._16_4_ * auVar88._16_4_;
          auVar41._20_4_ = auVar93._20_4_ * auVar88._20_4_;
          auVar41._24_4_ = auVar93._24_4_ * auVar88._24_4_;
          auVar41._28_4_ = auVar91._28_4_;
          auVar81 = vfmsub231ps_fma(auVar41,auVar92,auVar89);
          auVar42._4_4_ = auVar89._4_4_ * auVar90._4_4_;
          auVar42._0_4_ = auVar89._0_4_ * auVar90._0_4_;
          auVar42._8_4_ = auVar89._8_4_ * auVar90._8_4_;
          auVar42._12_4_ = auVar89._12_4_ * auVar90._12_4_;
          auVar42._16_4_ = auVar89._16_4_ * auVar90._16_4_;
          auVar42._20_4_ = auVar89._20_4_ * auVar90._20_4_;
          auVar42._24_4_ = auVar89._24_4_ * auVar90._24_4_;
          auVar42._28_4_ = auVar89._28_4_;
          auVar80 = vfmsub231ps_fma(auVar42,auVar94,auVar93);
          auVar43._4_4_ = auVar92._4_4_ * auVar94._4_4_;
          auVar43._0_4_ = auVar92._0_4_ * auVar94._0_4_;
          auVar43._8_4_ = auVar92._8_4_ * auVar94._8_4_;
          auVar43._12_4_ = auVar92._12_4_ * auVar94._12_4_;
          auVar43._16_4_ = auVar92._16_4_ * auVar94._16_4_;
          auVar43._20_4_ = auVar92._20_4_ * auVar94._20_4_;
          auVar43._24_4_ = auVar92._24_4_ * auVar94._24_4_;
          auVar43._28_4_ = auVar92._28_4_;
          auVar6 = vfmsub231ps_fma(auVar43,auVar90,auVar88);
          auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar6));
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar81),auVar97);
          auVar88 = vrcp14ps_avx512vl(auVar91);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar191 = ZEXT3264(auVar89);
          auVar90 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar89);
          auVar79 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
          auVar44._4_4_ = auVar6._4_4_ * auVar105._4_4_;
          auVar44._0_4_ = auVar6._0_4_ * auVar105._0_4_;
          auVar44._8_4_ = auVar6._8_4_ * auVar105._8_4_;
          auVar44._12_4_ = auVar6._12_4_ * auVar105._12_4_;
          auVar44._16_4_ = fVar149 * 0.0;
          auVar44._20_4_ = fVar131 * 0.0;
          auVar44._24_4_ = fVar132 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar80 = vfmadd231ps_fma(auVar44,auVar99,ZEXT1632(auVar80));
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,ZEXT1632(auVar81));
          fVar149 = auVar79._0_4_;
          fVar131 = auVar79._4_4_;
          fVar132 = auVar79._8_4_;
          fVar139 = auVar79._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar139,
                                         CONCAT48(auVar80._8_4_ * fVar132,
                                                  CONCAT44(auVar80._4_4_ * fVar131,
                                                           auVar80._0_4_ * fVar149))));
          auVar165._4_4_ = uVar73;
          auVar165._0_4_ = uVar73;
          auVar165._8_4_ = uVar73;
          auVar165._12_4_ = uVar73;
          auVar165._16_4_ = uVar73;
          auVar165._20_4_ = uVar73;
          auVar165._24_4_ = uVar73;
          auVar165._28_4_ = uVar73;
          uVar140 = vcmpps_avx512vl(local_260,auVar176,2);
          uVar22 = vcmpps_avx512vl(auVar165,local_260,2);
          bVar75 = (byte)uVar140 & (byte)uVar22 & bVar75;
          auVar193 = ZEXT3264(local_4c0);
          auVar192 = ZEXT3264(local_4e0);
          auVar183 = ZEXT3264(auVar95);
          if (bVar75 == 0) {
            uVar70 = 0;
            auVar190 = ZEXT3264(local_500);
          }
          else {
            uVar140 = vcmpps_avx512vl(auVar91,auVar97,4);
            bVar75 = bVar75 & (byte)uVar140;
            auVar190 = ZEXT3264(local_500);
            if (bVar75 != 0) {
              fVar161 = auVar87._0_4_ * fVar149;
              fVar163 = auVar87._4_4_ * fVar131;
              auVar45._4_4_ = fVar163;
              auVar45._0_4_ = fVar161;
              fVar77 = auVar87._8_4_ * fVar132;
              auVar45._8_4_ = fVar77;
              fVar78 = auVar87._12_4_ * fVar139;
              auVar45._12_4_ = fVar78;
              fVar123 = auVar87._16_4_ * 0.0;
              auVar45._16_4_ = fVar123;
              fVar148 = auVar87._20_4_ * 0.0;
              auVar45._20_4_ = fVar148;
              fVar124 = auVar87._24_4_ * 0.0;
              auVar45._24_4_ = fVar124;
              auVar45._28_4_ = auVar91._28_4_;
              auVar88 = vsubps_avx512vl(auVar89,auVar45);
              local_2a0._0_4_ =
                   (float)((uint)(bVar66 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar66 & 1) * auVar88._0_4_);
              bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar88._4_4_)
              ;
              bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar16 * (int)fVar77 | (uint)!bVar16 * auVar88._8_4_);
              bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar16 * (int)fVar78 | (uint)!bVar16 * auVar88._12_4_);
              bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar16 * (int)fVar123 | (uint)!bVar16 * auVar88._16_4_);
              bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar16 * (int)fVar148 | (uint)!bVar16 * auVar88._20_4_);
              bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar16 * (int)fVar124 | (uint)!bVar16 * auVar88._24_4_);
              bVar16 = SUB81(uVar76 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar16 * auVar91._28_4_ | (uint)!bVar16 * auVar88._28_4_);
              auVar91 = vsubps_avx(ZEXT1632(auVar11),auVar85);
              auVar79 = vfmadd213ps_fma(auVar91,local_2a0,auVar85);
              uVar133 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar24._4_4_ = uVar133;
              auVar24._0_4_ = uVar133;
              auVar24._8_4_ = uVar133;
              auVar24._12_4_ = uVar133;
              auVar24._16_4_ = uVar133;
              auVar24._20_4_ = uVar133;
              auVar24._24_4_ = uVar133;
              auVar24._28_4_ = uVar133;
              auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                           CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                    CONCAT44(auVar79._4_4_ +
                                                                             auVar79._4_4_,
                                                                             auVar79._0_4_ +
                                                                             auVar79._0_4_)))),
                                        auVar24);
              uVar140 = vcmpps_avx512vl(local_260,auVar91,6);
              if (((byte)uVar140 & bVar75) != 0) {
                auVar152._0_4_ = auVar96._0_4_ * fVar149;
                auVar152._4_4_ = auVar96._4_4_ * fVar131;
                auVar152._8_4_ = auVar96._8_4_ * fVar132;
                auVar152._12_4_ = auVar96._12_4_ * fVar139;
                auVar152._16_4_ = auVar96._16_4_ * 0.0;
                auVar152._20_4_ = auVar96._20_4_ * 0.0;
                auVar152._24_4_ = auVar96._24_4_ * 0.0;
                auVar152._28_4_ = 0;
                auVar91 = vsubps_avx512vl(auVar89,auVar152);
                auVar111._0_4_ =
                     (uint)(bVar66 & 1) * (int)auVar152._0_4_ |
                     (uint)!(bool)(bVar66 & 1) * auVar91._0_4_;
                bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                auVar111._4_4_ = (uint)bVar16 * (int)auVar152._4_4_ | (uint)!bVar16 * auVar91._4_4_;
                bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                auVar111._8_4_ = (uint)bVar16 * (int)auVar152._8_4_ | (uint)!bVar16 * auVar91._8_4_;
                bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
                auVar111._12_4_ =
                     (uint)bVar16 * (int)auVar152._12_4_ | (uint)!bVar16 * auVar91._12_4_;
                bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                auVar111._16_4_ =
                     (uint)bVar16 * (int)auVar152._16_4_ | (uint)!bVar16 * auVar91._16_4_;
                bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                auVar111._20_4_ =
                     (uint)bVar16 * (int)auVar152._20_4_ | (uint)!bVar16 * auVar91._20_4_;
                bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                auVar111._24_4_ =
                     (uint)bVar16 * (int)auVar152._24_4_ | (uint)!bVar16 * auVar91._24_4_;
                auVar111._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar91._28_4_;
                auVar25._8_4_ = 0x40000000;
                auVar25._0_8_ = 0x4000000040000000;
                auVar25._12_4_ = 0x40000000;
                auVar25._16_4_ = 0x40000000;
                auVar25._20_4_ = 0x40000000;
                auVar25._24_4_ = 0x40000000;
                auVar25._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar111,auVar89,auVar25);
                local_240 = 0;
                local_230 = local_510._0_8_;
                uStack_228 = local_510._8_8_;
                local_220 = local_520._0_8_;
                uStack_218 = local_520._8_8_;
                local_210 = local_530._0_8_;
                uStack_208 = local_530._8_8_;
                if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar70 = CONCAT71((int7)(uVar70 >> 8),1),
                     pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar149 = 1.0 / auVar168._0_4_;
                    local_1e0[0] = fVar149 * (local_2a0._0_4_ + 0.0);
                    local_1e0[1] = fVar149 * (local_2a0._4_4_ + 1.0);
                    local_1e0[2] = fVar149 * (local_2a0._8_4_ + 2.0);
                    local_1e0[3] = fVar149 * (local_2a0._12_4_ + 3.0);
                    fStack_1d0 = fVar149 * (local_2a0._16_4_ + 4.0);
                    fStack_1cc = fVar149 * (local_2a0._20_4_ + 5.0);
                    fStack_1c8 = fVar149 * (local_2a0._24_4_ + 6.0);
                    fStack_1c4 = local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    local_3a0 = 0;
                    uVar71 = (ulong)((byte)uVar140 & bVar75);
                    for (uVar76 = uVar71; (uVar76 & 1) == 0;
                        uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                      local_3a0 = local_3a0 + 1;
                    }
                    local_4a0 = vpbroadcastd_avx512vl();
                    local_560 = vpbroadcastd_avx512vl();
                    local_460 = auVar95;
                    local_400 = auVar176;
                    local_23c = iVar13;
                    do {
                      auVar81 = auVar189._0_16_;
                      local_320 = local_1e0[local_3a0];
                      local_310 = *(undefined4 *)(local_1c0 + local_3a0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1a0 + local_3a0 * 4);
                      local_5d0.context = context->user;
                      fVar131 = 1.0 - local_320;
                      fVar149 = fVar131 * fVar131 * -3.0;
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                ZEXT416((uint)(local_320 * fVar131)),
                                                ZEXT416(0xc0000000));
                      auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar131)),
                                                ZEXT416((uint)(local_320 * local_320)),
                                                ZEXT416(0x40000000));
                      fVar131 = auVar79._0_4_ * 3.0;
                      fVar132 = auVar80._0_4_ * 3.0;
                      fVar139 = local_320 * local_320 * 3.0;
                      auVar158._0_4_ = fVar139 * (float)local_3b0._0_4_;
                      auVar158._4_4_ = fVar139 * (float)local_3b0._4_4_;
                      auVar158._8_4_ = fVar139 * fStack_3a8;
                      auVar158._12_4_ = fVar139 * fStack_3a4;
                      auVar134._4_4_ = fVar132;
                      auVar134._0_4_ = fVar132;
                      auVar134._8_4_ = fVar132;
                      auVar134._12_4_ = fVar132;
                      auVar79 = vfmadd132ps_fma(auVar134,auVar158,local_530);
                      auVar150._4_4_ = fVar131;
                      auVar150._0_4_ = fVar131;
                      auVar150._8_4_ = fVar131;
                      auVar150._12_4_ = fVar131;
                      auVar79 = vfmadd132ps_fma(auVar150,auVar79,local_520);
                      auVar135._4_4_ = fVar149;
                      auVar135._0_4_ = fVar149;
                      auVar135._8_4_ = fVar149;
                      auVar135._12_4_ = fVar149;
                      auVar79 = vfmadd132ps_fma(auVar135,auVar79,local_510);
                      local_350 = auVar79._0_4_;
                      local_340 = vshufps_avx(auVar79,auVar79,0x55);
                      local_330 = vshufps_avx(auVar79,auVar79,0xaa);
                      local_300 = local_560._0_8_;
                      uStack_2f8 = local_560._8_8_;
                      local_2f0 = local_4a0;
                      vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                      uStack_2dc = (local_5d0.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_5d0.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_600 = local_3c0;
                      local_5d0.valid = (int *)local_600;
                      local_5d0.geometryUserPtr = pGVar72->userPtr;
                      local_5d0.hit = (RTCHitN *)&local_350;
                      local_5d0.N = 4;
                      local_380 = (uint)uVar71;
                      uStack_37c = (uint)(uVar71 >> 0x20);
                      local_5d0.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      fStack_31c = local_320;
                      fStack_318 = local_320;
                      fStack_314 = local_320;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar72->occlusionFilterN)(&local_5d0);
                        uVar71 = CONCAT44(uStack_37c,local_380);
                        auVar178 = ZEXT3264(local_400);
                        auVar183 = ZEXT3264(local_460);
                        auVar192 = ZEXT3264(local_4e0);
                        auVar193 = ZEXT3264(local_4c0);
                        auVar190 = ZEXT3264(local_500);
                        auVar184 = ZEXT3264(local_5a0);
                        auVar185 = ZEXT3264(local_580);
                        auVar188 = ZEXT3264(local_440);
                        auVar187 = ZEXT3264(local_3e0);
                        auVar186 = ZEXT3264(local_420);
                        auVar79 = vxorps_avx512vl(auVar81,auVar81);
                        auVar189 = ZEXT1664(auVar79);
                        uVar73 = local_480._0_4_;
                      }
                      auVar79 = auVar189._0_16_;
                      uVar76 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar76 & 0xf) == 0) {
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar191 = ZEXT3264(auVar91);
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if (p_Var15 == (RTCFilterFunctionN)0x0) {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar191 = ZEXT3264(auVar91);
                        }
                        else {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar191 = ZEXT3264(auVar91);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar72->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var15)(&local_5d0);
                            uVar71 = CONCAT44(uStack_37c,local_380);
                            auVar178 = ZEXT3264(local_400);
                            auVar183 = ZEXT3264(local_460);
                            auVar192 = ZEXT3264(local_4e0);
                            auVar193 = ZEXT3264(local_4c0);
                            auVar190 = ZEXT3264(local_500);
                            auVar184 = ZEXT3264(local_5a0);
                            auVar185 = ZEXT3264(local_580);
                            auVar188 = ZEXT3264(local_440);
                            auVar187 = ZEXT3264(local_3e0);
                            auVar186 = ZEXT3264(local_420);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar189 = ZEXT1664(auVar79);
                            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar191 = ZEXT3264(auVar91);
                            uVar73 = local_480._0_4_;
                          }
                        }
                        auVar95 = auVar183._0_32_;
                        uVar76 = vptestmd_avx512vl(local_600,local_600);
                        uVar76 = uVar76 & 0xf;
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar16 = (bool)((byte)uVar76 & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar19 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_5d0.ray + 0x80) =
                             (uint)bVar16 * auVar79._0_4_ |
                             (uint)!bVar16 * *(int *)(local_5d0.ray + 0x80);
                        *(uint *)(local_5d0.ray + 0x84) =
                             (uint)bVar17 * auVar79._4_4_ |
                             (uint)!bVar17 * *(int *)(local_5d0.ray + 0x84);
                        *(uint *)(local_5d0.ray + 0x88) =
                             (uint)bVar18 * auVar79._8_4_ |
                             (uint)!bVar18 * *(int *)(local_5d0.ray + 0x88);
                        *(uint *)(local_5d0.ray + 0x8c) =
                             (uint)bVar19 * auVar79._12_4_ |
                             (uint)!bVar19 * *(int *)(local_5d0.ray + 0x8c);
                        if ((byte)uVar76 != 0) {
                          uVar70 = CONCAT71((int7)(uVar70 >> 8),1);
                          break;
                        }
                      }
                      auVar95 = auVar183._0_32_;
                      *(int *)(ray + k * 4 + 0x80) = auVar178._0_4_;
                      uVar76 = local_3a0 & 0x3f;
                      uVar70 = 0;
                      local_3a0 = 0;
                      uVar71 = uVar71 ^ 1L << uVar76;
                      for (uVar76 = uVar71; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        local_3a0 = local_3a0 + 1;
                      }
                    } while (uVar71 != 0);
                  }
                  goto LAB_01dd76f3;
                }
              }
            }
            uVar70 = 0;
          }
        }
      }
LAB_01dd76f3:
      if (8 < iVar13) {
        local_480 = vpbroadcastd_avx512vl();
        uStack_2bc = local_2c0;
        uStack_2b8 = local_2c0;
        uStack_2b4 = local_2c0;
        uStack_2b0 = local_2c0;
        uStack_2ac = local_2c0;
        uStack_2a8 = local_2c0;
        uStack_2a4 = local_2c0;
        fStack_398 = 1.0 / (float)local_550._0_4_;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar74 = 8;
        local_460 = auVar95;
        fStack_394 = fStack_398;
        fStack_390 = fStack_398;
        fStack_38c = fStack_398;
        fStack_388 = fStack_398;
        fStack_384 = fStack_398;
        local_380 = uVar73;
        uStack_37c = uVar73;
        uStack_378 = uVar73;
        uStack_374 = uVar73;
        uStack_370 = uVar73;
        uStack_36c = uVar73;
        uStack_368 = uVar73;
        uStack_364 = uVar73;
        local_3a0._0_4_ = fStack_398;
        local_3a0._4_4_ = fStack_398;
        do {
          auVar91 = vpbroadcastd_avx512vl();
          auVar92 = vpor_avx2(auVar91,_DAT_01fe9900);
          uVar22 = vpcmpd_avx512vl(auVar92,local_480,1);
          auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar74 * 4 + lVar23);
          auVar88 = *(undefined1 (*) [32])(lVar23 + 0x21aa768 + lVar74 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar23 + 0x21aabec + lVar74 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar23 + 0x21ab070 + lVar74 * 4);
          local_4c0 = auVar193._0_32_;
          auVar93 = vmulps_avx512vl(local_4c0,auVar90);
          local_4e0 = auVar192._0_32_;
          auVar100 = vmulps_avx512vl(local_4e0,auVar90);
          auVar46._4_4_ = auVar90._4_4_ * (float)local_100._4_4_;
          auVar46._0_4_ = auVar90._0_4_ * (float)local_100._0_4_;
          auVar46._8_4_ = auVar90._8_4_ * fStack_f8;
          auVar46._12_4_ = auVar90._12_4_ * fStack_f4;
          auVar46._16_4_ = auVar90._16_4_ * fStack_f0;
          auVar46._20_4_ = auVar90._20_4_ * fStack_ec;
          auVar46._24_4_ = auVar90._24_4_ * fStack_e8;
          auVar46._28_4_ = auVar92._28_4_;
          auVar142 = auVar184._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar142);
          local_500 = auVar190._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar100,auVar89,local_500);
          auVar100 = vfmadd231ps_avx512vl(auVar46,auVar89,local_e0);
          auVar162 = auVar188._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar162);
          auVar146 = auVar185._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar146);
          auVar79 = vfmadd231ps_fma(auVar100,auVar88,local_c0);
          auVar160 = auVar186._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar160);
          local_3e0 = auVar187._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar93,auVar91,local_3e0);
          auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar74 * 4 + lVar23);
          auVar93 = *(undefined1 (*) [32])(lVar23 + 0x21acb88 + lVar74 * 4);
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar91,local_a0);
          auVar100 = *(undefined1 (*) [32])(lVar23 + 0x21ad00c + lVar74 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar23 + 0x21ad490 + lVar74 * 4);
          auVar95 = vmulps_avx512vl(local_4c0,auVar99);
          auVar94 = vmulps_avx512vl(local_4e0,auVar99);
          auVar47._4_4_ = auVar99._4_4_ * (float)local_100._4_4_;
          auVar47._0_4_ = auVar99._0_4_ * (float)local_100._0_4_;
          auVar47._8_4_ = auVar99._8_4_ * fStack_f8;
          auVar47._12_4_ = auVar99._12_4_ * fStack_f4;
          auVar47._16_4_ = auVar99._16_4_ * fStack_f0;
          auVar47._20_4_ = auVar99._20_4_ * fStack_ec;
          auVar47._24_4_ = auVar99._24_4_ * fStack_e8;
          auVar47._28_4_ = uStack_e4;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar142);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_500);
          auVar97 = vfmadd231ps_avx512vl(auVar47,auVar100,local_e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar162);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar146);
          auVar80 = vfmadd231ps_fma(auVar97,auVar93,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar160);
          auVar85 = vfmadd231ps_avx512vl(auVar94,auVar92,local_3e0);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar92,local_a0);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80));
          auVar95 = vsubps_avx(auVar97,auVar87);
          auVar94 = vsubps_avx(auVar85,auVar96);
          auVar98 = vmulps_avx512vl(auVar96,auVar95);
          auVar112 = vmulps_avx512vl(auVar87,auVar94);
          auVar98 = vsubps_avx512vl(auVar98,auVar112);
          auVar112 = vmulps_avx512vl(auVar94,auVar94);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar95,auVar95);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar112);
          auVar98 = vmulps_avx512vl(auVar98,auVar98);
          uVar140 = vcmpps_avx512vl(auVar98,auVar86,2);
          bVar75 = (byte)uVar22 & (byte)uVar140;
          if (bVar75 == 0) {
            auVar184 = ZEXT3264(auVar142);
          }
          else {
            auVar99 = vmulps_avx512vl(local_460,auVar99);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar100);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar93);
            auVar90 = vmulps_avx512vl(local_460,auVar90);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_160,auVar90);
            auVar88 = vfmadd213ps_avx512vl(auVar88,local_140,auVar89);
            auVar93 = vfmadd213ps_avx512vl(auVar91,local_120,auVar88);
            auVar91 = *(undefined1 (*) [32])(lVar23 + 0x21ab4f4 + lVar74 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar23 + 0x21ab978 + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar23 + 0x21abdfc + lVar74 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar23 + 0x21ac280 + lVar74 * 4);
            auVar100 = vmulps_avx512vl(local_4c0,auVar90);
            auVar99 = vmulps_avx512vl(local_4e0,auVar90);
            auVar90 = vmulps_avx512vl(local_460,auVar90);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,auVar142);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,local_500);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar162);
            auVar100 = vfmadd231ps_avx512vl(auVar99,auVar88,auVar146);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar160);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_3e0);
            auVar99 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar23 + 0x21ad914 + lVar74 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar23 + 0x21ae21c + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar23 + 0x21ae6a0 + lVar74 * 4);
            auVar86 = vmulps_avx512vl(local_4c0,auVar89);
            auVar98 = vmulps_avx512vl(local_4e0,auVar89);
            auVar89 = vmulps_avx512vl(local_460,auVar89);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar142);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_500);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_160,auVar88);
            auVar88 = *(undefined1 (*) [32])(lVar23 + 0x21add98 + lVar74 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar162);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar146);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
            auVar89 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar160);
            auVar86 = vfmadd231ps_avx512vl(auVar98,auVar91,local_3e0);
            auVar88 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar98);
            vandps_avx512vl(auVar100,auVar98);
            auVar91 = vmaxps_avx(auVar98,auVar98);
            vandps_avx512vl(auVar99,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar98);
            auVar65._4_4_ = uStack_2bc;
            auVar65._0_4_ = local_2c0;
            auVar65._8_4_ = uStack_2b8;
            auVar65._12_4_ = uStack_2b4;
            auVar65._16_4_ = uStack_2b0;
            auVar65._20_4_ = uStack_2ac;
            auVar65._24_4_ = uStack_2a8;
            auVar65._28_4_ = uStack_2a4;
            uVar76 = vcmpps_avx512vl(auVar91,auVar65,1);
            bVar16 = (bool)((byte)uVar76 & 1);
            auVar113._0_4_ = (float)((uint)bVar16 * auVar95._0_4_ | (uint)!bVar16 * auVar90._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar90._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar90._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar90._12_4_);
            bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar16 * auVar95._16_4_ | (uint)!bVar16 * auVar90._16_4_);
            bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar16 * auVar95._20_4_ | (uint)!bVar16 * auVar90._20_4_);
            bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar16 * auVar95._24_4_ | (uint)!bVar16 * auVar90._24_4_);
            bVar16 = SUB81(uVar76 >> 7,0);
            auVar113._28_4_ = (uint)bVar16 * auVar95._28_4_ | (uint)!bVar16 * auVar90._28_4_;
            bVar16 = (bool)((byte)uVar76 & 1);
            auVar114._0_4_ = (float)((uint)bVar16 * auVar94._0_4_ | (uint)!bVar16 * auVar100._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar100._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar100._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar100._12_4_);
            bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * auVar100._16_4_);
            bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * auVar100._20_4_);
            bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * auVar100._24_4_);
            bVar16 = SUB81(uVar76 >> 7,0);
            auVar114._28_4_ = (uint)bVar16 * auVar94._28_4_ | (uint)!bVar16 * auVar100._28_4_;
            vandps_avx512vl(auVar89,auVar98);
            vandps_avx512vl(auVar86,auVar98);
            auVar91 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar88,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar114);
            uVar76 = vcmpps_avx512vl(auVar91,auVar65,1);
            bVar16 = (bool)((byte)uVar76 & 1);
            auVar115._0_4_ = (uint)bVar16 * auVar95._0_4_ | (uint)!bVar16 * auVar89._0_4_;
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar89._4_4_;
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar89._8_4_;
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar89._12_4_;
            bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar115._16_4_ = (uint)bVar16 * auVar95._16_4_ | (uint)!bVar16 * auVar89._16_4_;
            bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar115._20_4_ = (uint)bVar16 * auVar95._20_4_ | (uint)!bVar16 * auVar89._20_4_;
            bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar115._24_4_ = (uint)bVar16 * auVar95._24_4_ | (uint)!bVar16 * auVar89._24_4_;
            bVar16 = SUB81(uVar76 >> 7,0);
            auVar115._28_4_ = (uint)bVar16 * auVar95._28_4_ | (uint)!bVar16 * auVar89._28_4_;
            bVar16 = (bool)((byte)uVar76 & 1);
            auVar116._0_4_ = (float)((uint)bVar16 * auVar94._0_4_ | (uint)!bVar16 * auVar86._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar86._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar86._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar86._12_4_);
            bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar16 * auVar94._16_4_ | (uint)!bVar16 * auVar86._16_4_);
            bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar16 * auVar94._20_4_ | (uint)!bVar16 * auVar86._20_4_);
            bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar16 * auVar94._24_4_ | (uint)!bVar16 * auVar86._24_4_);
            bVar16 = SUB81(uVar76 >> 7,0);
            auVar116._28_4_ = (uint)bVar16 * auVar94._28_4_ | (uint)!bVar16 * auVar86._28_4_;
            auVar170._8_4_ = 0x80000000;
            auVar170._0_8_ = 0x8000000080000000;
            auVar170._12_4_ = 0x80000000;
            auVar170._16_4_ = 0x80000000;
            auVar170._20_4_ = 0x80000000;
            auVar170._24_4_ = 0x80000000;
            auVar170._28_4_ = 0x80000000;
            auVar91 = vxorps_avx512vl(auVar115,auVar170);
            auVar86 = auVar189._0_32_;
            auVar88 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar86);
            auVar81 = vfmadd231ps_fma(auVar88,auVar114,auVar114);
            auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar182._8_4_ = 0xbf000000;
            auVar182._0_8_ = 0xbf000000bf000000;
            auVar182._12_4_ = 0xbf000000;
            auVar182._16_4_ = 0xbf000000;
            auVar182._20_4_ = 0xbf000000;
            auVar182._24_4_ = 0xbf000000;
            auVar182._28_4_ = 0xbf000000;
            fVar149 = auVar88._0_4_;
            fVar131 = auVar88._4_4_;
            fVar132 = auVar88._8_4_;
            fVar139 = auVar88._12_4_;
            fVar161 = auVar88._16_4_;
            fVar163 = auVar88._20_4_;
            fVar77 = auVar88._24_4_;
            auVar48._4_4_ = fVar131 * fVar131 * fVar131 * auVar81._4_4_ * -0.5;
            auVar48._0_4_ = fVar149 * fVar149 * fVar149 * auVar81._0_4_ * -0.5;
            auVar48._8_4_ = fVar132 * fVar132 * fVar132 * auVar81._8_4_ * -0.5;
            auVar48._12_4_ = fVar139 * fVar139 * fVar139 * auVar81._12_4_ * -0.5;
            auVar48._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar48._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar48._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
            auVar48._28_4_ = auVar114._28_4_;
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar88 = vfmadd231ps_avx512vl(auVar48,auVar89,auVar88);
            auVar49._4_4_ = auVar114._4_4_ * auVar88._4_4_;
            auVar49._0_4_ = auVar114._0_4_ * auVar88._0_4_;
            auVar49._8_4_ = auVar114._8_4_ * auVar88._8_4_;
            auVar49._12_4_ = auVar114._12_4_ * auVar88._12_4_;
            auVar49._16_4_ = auVar114._16_4_ * auVar88._16_4_;
            auVar49._20_4_ = auVar114._20_4_ * auVar88._20_4_;
            auVar49._24_4_ = auVar114._24_4_ * auVar88._24_4_;
            auVar49._28_4_ = 0;
            auVar50._4_4_ = auVar88._4_4_ * -auVar113._4_4_;
            auVar50._0_4_ = auVar88._0_4_ * -auVar113._0_4_;
            auVar50._8_4_ = auVar88._8_4_ * -auVar113._8_4_;
            auVar50._12_4_ = auVar88._12_4_ * -auVar113._12_4_;
            auVar50._16_4_ = auVar88._16_4_ * -auVar113._16_4_;
            auVar50._20_4_ = auVar88._20_4_ * -auVar113._20_4_;
            auVar50._24_4_ = auVar88._24_4_ * -auVar113._24_4_;
            auVar50._28_4_ = auVar114._28_4_;
            auVar90 = vmulps_avx512vl(auVar88,auVar86);
            auVar88 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar86);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar116,auVar116);
            auVar100 = vrsqrt14ps_avx512vl(auVar88);
            auVar88 = vmulps_avx512vl(auVar88,auVar182);
            fVar149 = auVar100._0_4_;
            fVar131 = auVar100._4_4_;
            fVar132 = auVar100._8_4_;
            fVar139 = auVar100._12_4_;
            fVar161 = auVar100._16_4_;
            fVar163 = auVar100._20_4_;
            fVar77 = auVar100._24_4_;
            auVar51._4_4_ = fVar131 * fVar131 * fVar131 * auVar88._4_4_;
            auVar51._0_4_ = fVar149 * fVar149 * fVar149 * auVar88._0_4_;
            auVar51._8_4_ = fVar132 * fVar132 * fVar132 * auVar88._8_4_;
            auVar51._12_4_ = fVar139 * fVar139 * fVar139 * auVar88._12_4_;
            auVar51._16_4_ = fVar161 * fVar161 * fVar161 * auVar88._16_4_;
            auVar51._20_4_ = fVar163 * fVar163 * fVar163 * auVar88._20_4_;
            auVar51._24_4_ = fVar77 * fVar77 * fVar77 * auVar88._24_4_;
            auVar51._28_4_ = auVar88._28_4_;
            auVar88 = vfmadd231ps_avx512vl(auVar51,auVar89,auVar100);
            auVar52._4_4_ = auVar116._4_4_ * auVar88._4_4_;
            auVar52._0_4_ = auVar116._0_4_ * auVar88._0_4_;
            auVar52._8_4_ = auVar116._8_4_ * auVar88._8_4_;
            auVar52._12_4_ = auVar116._12_4_ * auVar88._12_4_;
            auVar52._16_4_ = auVar116._16_4_ * auVar88._16_4_;
            auVar52._20_4_ = auVar116._20_4_ * auVar88._20_4_;
            auVar52._24_4_ = auVar116._24_4_ * auVar88._24_4_;
            auVar52._28_4_ = auVar100._28_4_;
            auVar53._4_4_ = auVar88._4_4_ * auVar91._4_4_;
            auVar53._0_4_ = auVar88._0_4_ * auVar91._0_4_;
            auVar53._8_4_ = auVar88._8_4_ * auVar91._8_4_;
            auVar53._12_4_ = auVar88._12_4_ * auVar91._12_4_;
            auVar53._16_4_ = auVar88._16_4_ * auVar91._16_4_;
            auVar53._20_4_ = auVar88._20_4_ * auVar91._20_4_;
            auVar53._24_4_ = auVar88._24_4_ * auVar91._24_4_;
            auVar53._28_4_ = auVar91._28_4_;
            auVar91 = vmulps_avx512vl(auVar88,auVar86);
            auVar81 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar79),auVar87);
            auVar88 = ZEXT1632(auVar79);
            auVar6 = vfmadd213ps_fma(auVar50,auVar88,auVar96);
            auVar89 = vfmadd213ps_avx512vl(auVar90,auVar88,auVar93);
            auVar100 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar80),auVar97);
            auVar11 = vfnmadd213ps_fma(auVar49,auVar88,auVar87);
            auVar99 = ZEXT1632(auVar80);
            auVar7 = vfmadd213ps_fma(auVar53,auVar99,auVar85);
            auVar82 = vfnmadd213ps_fma(auVar50,auVar88,auVar96);
            auVar8 = vfmadd213ps_fma(auVar91,auVar99,auVar92);
            auVar96 = ZEXT1632(auVar79);
            auVar84 = vfnmadd231ps_fma(auVar93,auVar96,auVar90);
            auVar83 = vfnmadd213ps_fma(auVar52,auVar99,auVar97);
            auVar141 = vfnmadd213ps_fma(auVar53,auVar99,auVar85);
            auVar144 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar80),auVar91);
            auVar92 = vsubps_avx512vl(auVar100,ZEXT1632(auVar11));
            auVar91 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar82));
            auVar88 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar84));
            auVar54._4_4_ = auVar91._4_4_ * auVar84._4_4_;
            auVar54._0_4_ = auVar91._0_4_ * auVar84._0_4_;
            auVar54._8_4_ = auVar91._8_4_ * auVar84._8_4_;
            auVar54._12_4_ = auVar91._12_4_ * auVar84._12_4_;
            auVar54._16_4_ = auVar91._16_4_ * 0.0;
            auVar54._20_4_ = auVar91._20_4_ * 0.0;
            auVar54._24_4_ = auVar91._24_4_ * 0.0;
            auVar54._28_4_ = auVar90._28_4_;
            auVar79 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar82),auVar88);
            auVar55._4_4_ = auVar88._4_4_ * auVar11._4_4_;
            auVar55._0_4_ = auVar88._0_4_ * auVar11._0_4_;
            auVar55._8_4_ = auVar88._8_4_ * auVar11._8_4_;
            auVar55._12_4_ = auVar88._12_4_ * auVar11._12_4_;
            auVar55._16_4_ = auVar88._16_4_ * 0.0;
            auVar55._20_4_ = auVar88._20_4_ * 0.0;
            auVar55._24_4_ = auVar88._24_4_ * 0.0;
            auVar55._28_4_ = auVar88._28_4_;
            auVar9 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar84),auVar92);
            auVar56._4_4_ = auVar82._4_4_ * auVar92._4_4_;
            auVar56._0_4_ = auVar82._0_4_ * auVar92._0_4_;
            auVar56._8_4_ = auVar82._8_4_ * auVar92._8_4_;
            auVar56._12_4_ = auVar82._12_4_ * auVar92._12_4_;
            auVar56._16_4_ = auVar92._16_4_ * 0.0;
            auVar56._20_4_ = auVar92._20_4_ * 0.0;
            auVar56._24_4_ = auVar92._24_4_ * 0.0;
            auVar56._28_4_ = auVar92._28_4_;
            auVar10 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar11),auVar91);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar86,ZEXT1632(auVar9));
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            uVar76 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar66 = (byte)uVar76;
            fVar148 = (float)((uint)(bVar66 & 1) * auVar81._0_4_ |
                             (uint)!(bool)(bVar66 & 1) * auVar83._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar125 = (float)((uint)bVar16 * auVar81._4_4_ | (uint)!bVar16 * auVar83._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar128 = (float)((uint)bVar16 * auVar81._8_4_ | (uint)!bVar16 * auVar83._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar129 = (float)((uint)bVar16 * auVar81._12_4_ | (uint)!bVar16 * auVar83._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar125,fVar148))));
            fVar124 = (float)((uint)(bVar66 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar66 & 1) * auVar141._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar127 = (float)((uint)bVar16 * auVar6._4_4_ | (uint)!bVar16 * auVar141._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar126 = (float)((uint)bVar16 * auVar6._8_4_ | (uint)!bVar16 * auVar141._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar130 = (float)((uint)bVar16 * auVar6._12_4_ | (uint)!bVar16 * auVar141._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar127,fVar124))));
            auVar117._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar144._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar144._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar144._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar144._12_4_);
            fVar132 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar89._16_4_);
            auVar117._16_4_ = fVar132;
            fVar149 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar89._20_4_);
            auVar117._20_4_ = fVar149;
            fVar131 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar89._24_4_);
            auVar117._24_4_ = fVar131;
            iVar1 = (uint)(byte)(uVar76 >> 7) * auVar89._28_4_;
            auVar117._28_4_ = iVar1;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar100);
            auVar118._0_4_ =
                 (uint)(bVar66 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar79._0_4_;
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar79._4_4_;
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar79._8_4_;
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar79._12_4_;
            auVar118._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar91._16_4_;
            auVar118._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar91._20_4_;
            auVar118._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar91._24_4_;
            auVar118._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar7));
            auVar119._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar81._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar81._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar81._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar81._12_4_);
            fVar163 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar91._16_4_);
            auVar119._16_4_ = fVar163;
            fVar161 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar91._20_4_);
            auVar119._20_4_ = fVar161;
            fVar139 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar91._24_4_);
            auVar119._24_4_ = fVar139;
            auVar119._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar8));
            auVar120._0_4_ =
                 (float)((uint)(bVar66 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar66 & 1) * auVar6._0_4_);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar16 * auVar91._4_4_ | (uint)!bVar16 * auVar6._4_4_);
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar16 * auVar91._8_4_ | (uint)!bVar16 * auVar6._8_4_);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar120._12_4_ = (float)((uint)bVar16 * auVar91._12_4_ | (uint)!bVar16 * auVar6._12_4_)
            ;
            fVar123 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar91._16_4_);
            auVar120._16_4_ = fVar123;
            fVar78 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar91._20_4_);
            auVar120._20_4_ = fVar78;
            fVar77 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar91._24_4_);
            auVar120._24_4_ = fVar77;
            iVar2 = (uint)(byte)(uVar76 >> 7) * auVar91._28_4_;
            auVar120._28_4_ = iVar2;
            auVar121._0_4_ =
                 (uint)(bVar66 & 1) * (int)auVar11._0_4_ |
                 (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar16 * (int)auVar11._4_4_ | (uint)!bVar16 * auVar100._4_4_;
            bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar16 * (int)auVar11._8_4_ | (uint)!bVar16 * auVar100._8_4_;
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar16 * (int)auVar11._12_4_ | (uint)!bVar16 * auVar100._12_4_;
            auVar121._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_;
            auVar121._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_;
            auVar121._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_;
            auVar121._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar100._28_4_;
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar100 = vsubps_avx512vl(auVar121,auVar99);
            auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar82._12_4_ |
                                                    (uint)!bVar20 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar18 * (int)auVar82._8_4_ |
                                                             (uint)!bVar18 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar16 *
                                                                      (int)auVar82._4_4_ |
                                                                      (uint)!bVar16 * auVar7._4_4_,
                                                                      (uint)(bVar66 & 1) *
                                                                      (int)auVar82._0_4_ |
                                                                      (uint)!(bool)(bVar66 & 1) *
                                                                      auVar7._0_4_)))),auVar95);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar84._12_4_ |
                                                    (uint)!bVar21 * auVar8._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar84._8_4_ |
                                                             (uint)!bVar19 * auVar8._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar84._4_4_ |
                                                                      (uint)!bVar17 * auVar8._4_4_,
                                                                      (uint)(bVar66 & 1) *
                                                                      (int)auVar84._0_4_ |
                                                                      (uint)!(bool)(bVar66 & 1) *
                                                                      auVar8._0_4_)))),auVar117);
            auVar90 = vsubps_avx(auVar99,auVar118);
            auVar92 = vsubps_avx(auVar95,auVar119);
            auVar93 = vsubps_avx(auVar117,auVar120);
            auVar57._4_4_ = auVar89._4_4_ * fVar125;
            auVar57._0_4_ = auVar89._0_4_ * fVar148;
            auVar57._8_4_ = auVar89._8_4_ * fVar128;
            auVar57._12_4_ = auVar89._12_4_ * fVar129;
            auVar57._16_4_ = auVar89._16_4_ * 0.0;
            auVar57._20_4_ = auVar89._20_4_ * 0.0;
            auVar57._24_4_ = auVar89._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar57,auVar117,auVar100);
            auVar153._0_4_ = fVar124 * auVar100._0_4_;
            auVar153._4_4_ = fVar127 * auVar100._4_4_;
            auVar153._8_4_ = fVar126 * auVar100._8_4_;
            auVar153._12_4_ = fVar130 * auVar100._12_4_;
            auVar153._16_4_ = auVar100._16_4_ * 0.0;
            auVar153._20_4_ = auVar100._20_4_ * 0.0;
            auVar153._24_4_ = auVar100._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar153,auVar99,auVar88);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar86,ZEXT1632(auVar79));
            auVar156._0_4_ = auVar88._0_4_ * auVar117._0_4_;
            auVar156._4_4_ = auVar88._4_4_ * auVar117._4_4_;
            auVar156._8_4_ = auVar88._8_4_ * auVar117._8_4_;
            auVar156._12_4_ = auVar88._12_4_ * auVar117._12_4_;
            auVar156._16_4_ = auVar88._16_4_ * fVar132;
            auVar156._20_4_ = auVar88._20_4_ * fVar149;
            auVar156._24_4_ = auVar88._24_4_ * fVar131;
            auVar156._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar156,auVar95,auVar89);
            auVar94 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            auVar91 = vmulps_avx512vl(auVar93,auVar118);
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar120);
            auVar58._4_4_ = auVar92._4_4_ * auVar120._4_4_;
            auVar58._0_4_ = auVar92._0_4_ * auVar120._0_4_;
            auVar58._8_4_ = auVar92._8_4_ * auVar120._8_4_;
            auVar58._12_4_ = auVar92._12_4_ * auVar120._12_4_;
            auVar58._16_4_ = auVar92._16_4_ * fVar123;
            auVar58._20_4_ = auVar92._20_4_ * fVar78;
            auVar58._24_4_ = auVar92._24_4_ * fVar77;
            auVar58._28_4_ = iVar2;
            auVar79 = vfmsub231ps_fma(auVar58,auVar119,auVar93);
            auVar157._0_4_ = auVar119._0_4_ * auVar90._0_4_;
            auVar157._4_4_ = auVar119._4_4_ * auVar90._4_4_;
            auVar157._8_4_ = auVar119._8_4_ * auVar90._8_4_;
            auVar157._12_4_ = auVar119._12_4_ * auVar90._12_4_;
            auVar157._16_4_ = fVar163 * auVar90._16_4_;
            auVar157._20_4_ = fVar161 * auVar90._20_4_;
            auVar157._24_4_ = fVar139 * auVar90._24_4_;
            auVar157._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar157,auVar92,auVar118);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar86,auVar91);
            auVar87 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar79));
            auVar91 = vmaxps_avx(auVar94,auVar87);
            uVar140 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar75 = bVar75 & (byte)uVar140;
            if (bVar75 != 0) {
              uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar177._4_4_ = uVar133;
              auVar177._0_4_ = uVar133;
              auVar177._8_4_ = uVar133;
              auVar177._12_4_ = uVar133;
              auVar177._16_4_ = uVar133;
              auVar177._20_4_ = uVar133;
              auVar177._24_4_ = uVar133;
              auVar177._28_4_ = uVar133;
              auVar178 = ZEXT3264(auVar177);
              auVar59._4_4_ = auVar93._4_4_ * auVar88._4_4_;
              auVar59._0_4_ = auVar93._0_4_ * auVar88._0_4_;
              auVar59._8_4_ = auVar93._8_4_ * auVar88._8_4_;
              auVar59._12_4_ = auVar93._12_4_ * auVar88._12_4_;
              auVar59._16_4_ = auVar93._16_4_ * auVar88._16_4_;
              auVar59._20_4_ = auVar93._20_4_ * auVar88._20_4_;
              auVar59._24_4_ = auVar93._24_4_ * auVar88._24_4_;
              auVar59._28_4_ = auVar91._28_4_;
              auVar6 = vfmsub231ps_fma(auVar59,auVar92,auVar89);
              auVar60._4_4_ = auVar89._4_4_ * auVar90._4_4_;
              auVar60._0_4_ = auVar89._0_4_ * auVar90._0_4_;
              auVar60._8_4_ = auVar89._8_4_ * auVar90._8_4_;
              auVar60._12_4_ = auVar89._12_4_ * auVar90._12_4_;
              auVar60._16_4_ = auVar89._16_4_ * auVar90._16_4_;
              auVar60._20_4_ = auVar89._20_4_ * auVar90._20_4_;
              auVar60._24_4_ = auVar89._24_4_ * auVar90._24_4_;
              auVar60._28_4_ = auVar89._28_4_;
              auVar81 = vfmsub231ps_fma(auVar60,auVar100,auVar93);
              auVar61._4_4_ = auVar92._4_4_ * auVar100._4_4_;
              auVar61._0_4_ = auVar92._0_4_ * auVar100._0_4_;
              auVar61._8_4_ = auVar92._8_4_ * auVar100._8_4_;
              auVar61._12_4_ = auVar92._12_4_ * auVar100._12_4_;
              auVar61._16_4_ = auVar92._16_4_ * auVar100._16_4_;
              auVar61._20_4_ = auVar92._20_4_ * auVar100._20_4_;
              auVar61._24_4_ = auVar92._24_4_ * auVar100._24_4_;
              auVar61._28_4_ = auVar92._28_4_;
              auVar7 = vfmsub231ps_fma(auVar61,auVar90,auVar88);
              auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar7));
              auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar6),auVar86);
              auVar88 = vrcp14ps_avx512vl(auVar91);
              auVar90 = auVar191._0_32_;
              auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar90);
              auVar79 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
              auVar62._4_4_ = auVar7._4_4_ * auVar117._4_4_;
              auVar62._0_4_ = auVar7._0_4_ * auVar117._0_4_;
              auVar62._8_4_ = auVar7._8_4_ * auVar117._8_4_;
              auVar62._12_4_ = auVar7._12_4_ * auVar117._12_4_;
              auVar62._16_4_ = fVar132 * 0.0;
              auVar62._20_4_ = fVar149 * 0.0;
              auVar62._24_4_ = fVar131 * 0.0;
              auVar62._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar62,auVar95,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar6));
              fVar149 = auVar79._0_4_;
              fVar131 = auVar79._4_4_;
              fVar132 = auVar79._8_4_;
              fVar139 = auVar79._12_4_;
              local_260 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar139,
                                             CONCAT48(auVar81._8_4_ * fVar132,
                                                      CONCAT44(auVar81._4_4_ * fVar131,
                                                               auVar81._0_4_ * fVar149))));
              uVar140 = vcmpps_avx512vl(local_260,auVar177,2);
              auVar64._4_4_ = uStack_37c;
              auVar64._0_4_ = local_380;
              auVar64._8_4_ = uStack_378;
              auVar64._12_4_ = uStack_374;
              auVar64._16_4_ = uStack_370;
              auVar64._20_4_ = uStack_36c;
              auVar64._24_4_ = uStack_368;
              auVar64._28_4_ = uStack_364;
              uVar22 = vcmpps_avx512vl(local_260,auVar64,0xd);
              bVar75 = (byte)uVar140 & (byte)uVar22 & bVar75;
              if (bVar75 != 0) {
                uVar140 = vcmpps_avx512vl(auVar91,auVar86,4);
                bVar75 = bVar75 & (byte)uVar140;
                auVar185 = ZEXT3264(local_580);
                auVar184 = ZEXT3264(local_5a0);
                if (bVar75 != 0) {
                  fVar161 = auVar94._0_4_ * fVar149;
                  fVar163 = auVar94._4_4_ * fVar131;
                  auVar63._4_4_ = fVar163;
                  auVar63._0_4_ = fVar161;
                  fVar77 = auVar94._8_4_ * fVar132;
                  auVar63._8_4_ = fVar77;
                  fVar78 = auVar94._12_4_ * fVar139;
                  auVar63._12_4_ = fVar78;
                  fVar123 = auVar94._16_4_ * 0.0;
                  auVar63._16_4_ = fVar123;
                  fVar148 = auVar94._20_4_ * 0.0;
                  auVar63._20_4_ = fVar148;
                  fVar124 = auVar94._24_4_ * 0.0;
                  auVar63._24_4_ = fVar124;
                  auVar63._28_4_ = auVar91._28_4_;
                  auVar88 = vsubps_avx512vl(auVar90,auVar63);
                  local_2a0._0_4_ =
                       (float)((uint)(bVar66 & 1) * (int)fVar161 |
                              (uint)!(bool)(bVar66 & 1) * auVar88._0_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                  local_2a0._4_4_ =
                       (float)((uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar88._4_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                  local_2a0._8_4_ =
                       (float)((uint)bVar16 * (int)fVar77 | (uint)!bVar16 * auVar88._8_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
                  local_2a0._12_4_ =
                       (float)((uint)bVar16 * (int)fVar78 | (uint)!bVar16 * auVar88._12_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                  local_2a0._16_4_ =
                       (float)((uint)bVar16 * (int)fVar123 | (uint)!bVar16 * auVar88._16_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                  local_2a0._20_4_ =
                       (float)((uint)bVar16 * (int)fVar148 | (uint)!bVar16 * auVar88._20_4_);
                  bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                  local_2a0._24_4_ =
                       (float)((uint)bVar16 * (int)fVar124 | (uint)!bVar16 * auVar88._24_4_);
                  bVar16 = SUB81(uVar76 >> 7,0);
                  local_2a0._28_4_ =
                       (float)((uint)bVar16 * auVar91._28_4_ | (uint)!bVar16 * auVar88._28_4_);
                  auVar91 = vsubps_avx(ZEXT1632(auVar80),auVar96);
                  auVar79 = vfmadd213ps_fma(auVar91,local_2a0,auVar96);
                  uVar133 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                  auVar27._4_4_ = uVar133;
                  auVar27._0_4_ = uVar133;
                  auVar27._8_4_ = uVar133;
                  auVar27._12_4_ = uVar133;
                  auVar27._16_4_ = uVar133;
                  auVar27._20_4_ = uVar133;
                  auVar27._24_4_ = uVar133;
                  auVar27._28_4_ = uVar133;
                  auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                               CONCAT48(auVar79._8_4_ +
                                                                        auVar79._8_4_,
                                                                        CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                            auVar27);
                  uVar140 = vcmpps_avx512vl(local_260,auVar91,6);
                  if (((byte)uVar140 & bVar75) != 0) {
                    auVar143._0_4_ = auVar87._0_4_ * fVar149;
                    auVar143._4_4_ = auVar87._4_4_ * fVar131;
                    auVar143._8_4_ = auVar87._8_4_ * fVar132;
                    auVar143._12_4_ = auVar87._12_4_ * fVar139;
                    auVar143._16_4_ = auVar87._16_4_ * 0.0;
                    auVar143._20_4_ = auVar87._20_4_ * 0.0;
                    auVar143._24_4_ = auVar87._24_4_ * 0.0;
                    auVar143._28_4_ = 0;
                    auVar91 = vsubps_avx512vl(auVar90,auVar143);
                    auVar122._0_4_ =
                         (uint)(bVar66 & 1) * (int)auVar143._0_4_ |
                         (uint)!(bool)(bVar66 & 1) * auVar91._0_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar122._4_4_ =
                         (uint)bVar16 * (int)auVar143._4_4_ | (uint)!bVar16 * auVar91._4_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar122._8_4_ =
                         (uint)bVar16 * (int)auVar143._8_4_ | (uint)!bVar16 * auVar91._8_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar16 * (int)auVar143._12_4_ | (uint)!bVar16 * auVar91._12_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                    auVar122._16_4_ =
                         (uint)bVar16 * (int)auVar143._16_4_ | (uint)!bVar16 * auVar91._16_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                    auVar122._20_4_ =
                         (uint)bVar16 * (int)auVar143._20_4_ | (uint)!bVar16 * auVar91._20_4_;
                    bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                    auVar122._24_4_ =
                         (uint)bVar16 * (int)auVar143._24_4_ | (uint)!bVar16 * auVar91._24_4_;
                    auVar122._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar91._28_4_;
                    auVar28._8_4_ = 0x40000000;
                    auVar28._0_8_ = 0x4000000040000000;
                    auVar28._12_4_ = 0x40000000;
                    auVar28._16_4_ = 0x40000000;
                    auVar28._20_4_ = 0x40000000;
                    auVar28._24_4_ = 0x40000000;
                    auVar28._28_4_ = 0x40000000;
                    local_280 = vfmsub132ps_avx512vl(auVar122,auVar90,auVar28);
                    local_240 = (undefined4)lVar74;
                    local_230 = local_510._0_8_;
                    uStack_228 = local_510._8_8_;
                    local_220 = local_520._0_8_;
                    uStack_218 = local_520._8_8_;
                    local_210 = local_530._0_8_;
                    uStack_208 = local_530._8_8_;
                    pGVar72 = (context->scene->geometries).items[local_5e8].ptr;
                    if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar66 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar66 = 1, pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar79 = vcvtsi2ss_avx512f(auVar98._0_16_,local_240);
                      fVar149 = auVar79._0_4_;
                      local_1e0[0] = (fVar149 + local_2a0._0_4_ + 0.0) * (float)local_3a0;
                      local_1e0[1] = (fVar149 + local_2a0._4_4_ + 1.0) * local_3a0._4_4_;
                      local_1e0[2] = (fVar149 + local_2a0._8_4_ + 2.0) * fStack_398;
                      local_1e0[3] = (fVar149 + local_2a0._12_4_ + 3.0) * fStack_394;
                      fStack_1d0 = (fVar149 + local_2a0._16_4_ + 4.0) * fStack_390;
                      fStack_1cc = (fVar149 + local_2a0._20_4_ + 5.0) * fStack_38c;
                      fStack_1c8 = (fVar149 + local_2a0._24_4_ + 6.0) * fStack_388;
                      fStack_1c4 = fVar149 + local_2a0._28_4_ + 7.0;
                      local_1c0 = local_280;
                      local_1a0 = local_260;
                      lVar67 = 0;
                      uVar71 = (ulong)((byte)uVar140 & bVar75);
                      for (uVar76 = uVar71; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        lVar67 = lVar67 + 1;
                      }
                      local_400._0_4_ = (int)uVar70;
                      local_180 = auVar177;
                      local_5e0 = pGVar72;
                      local_23c = iVar13;
                      do {
                        auVar81 = auVar189._0_16_;
                        local_320 = local_1e0[lVar67];
                        local_4a0._0_8_ = lVar67;
                        local_310 = *(undefined4 *)(local_1c0 + lVar67 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + lVar67 * 4);
                        local_5d0.context = context->user;
                        fVar131 = 1.0 - local_320;
                        fVar149 = fVar131 * fVar131 * -3.0;
                        auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                  ZEXT416((uint)(local_320 * fVar131)),
                                                  ZEXT416(0xc0000000));
                        auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar131)),
                                                  ZEXT416((uint)(local_320 * local_320)),
                                                  ZEXT416(0x40000000));
                        fVar131 = auVar79._0_4_ * 3.0;
                        fVar132 = auVar80._0_4_ * 3.0;
                        fVar139 = local_320 * local_320 * 3.0;
                        auVar159._0_4_ = fVar139 * (float)local_3b0._0_4_;
                        auVar159._4_4_ = fVar139 * (float)local_3b0._4_4_;
                        auVar159._8_4_ = fVar139 * fStack_3a8;
                        auVar159._12_4_ = fVar139 * fStack_3a4;
                        auVar136._4_4_ = fVar132;
                        auVar136._0_4_ = fVar132;
                        auVar136._8_4_ = fVar132;
                        auVar136._12_4_ = fVar132;
                        auVar79 = vfmadd132ps_fma(auVar136,auVar159,local_530);
                        auVar151._4_4_ = fVar131;
                        auVar151._0_4_ = fVar131;
                        auVar151._8_4_ = fVar131;
                        auVar151._12_4_ = fVar131;
                        auVar79 = vfmadd132ps_fma(auVar151,auVar79,local_520);
                        auVar137._4_4_ = fVar149;
                        auVar137._0_4_ = fVar149;
                        auVar137._8_4_ = fVar149;
                        auVar137._12_4_ = fVar149;
                        auVar79 = vfmadd132ps_fma(auVar137,auVar79,local_510);
                        local_350 = auVar79._0_4_;
                        local_340 = vshufps_avx(auVar79,auVar79,0x55);
                        local_330 = vshufps_avx(auVar79,auVar79,0xaa);
                        local_300 = local_540._0_8_;
                        uStack_2f8 = local_540._8_8_;
                        local_2f0 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_2dc = (local_5d0.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_5d0.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_600 = local_3c0;
                        local_5d0.valid = (int *)local_600;
                        local_5d0.geometryUserPtr = pGVar72->userPtr;
                        local_5d0.hit = (RTCHitN *)&local_350;
                        local_5d0.N = 4;
                        local_560._0_8_ = uVar71;
                        local_5d0.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        fStack_31c = local_320;
                        fStack_318 = local_320;
                        fStack_314 = local_320;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar72->occlusionFilterN)(&local_5d0);
                          auVar178 = ZEXT3264(local_180);
                          uVar70 = (ulong)(uint)local_400._0_4_;
                          auVar184 = ZEXT3264(local_5a0);
                          auVar185 = ZEXT3264(local_580);
                          auVar188 = ZEXT3264(local_440);
                          auVar187 = ZEXT3264(local_3e0);
                          auVar186 = ZEXT3264(local_420);
                          auVar79 = vxorps_avx512vl(auVar81,auVar81);
                          auVar189 = ZEXT1664(auVar79);
                          pGVar72 = local_5e0;
                          uVar71 = local_560._0_8_;
                        }
                        auVar79 = auVar189._0_16_;
                        uVar76 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar76 & 0xf) == 0) {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar191 = ZEXT3264(auVar91);
                          auVar190 = ZEXT3264(local_500);
                          auVar193 = ZEXT3264(local_4c0);
                          auVar192 = ZEXT3264(local_4e0);
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar72->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var15)(&local_5d0);
                            auVar178 = ZEXT3264(local_180);
                            uVar70 = (ulong)(uint)local_400._0_4_;
                            auVar184 = ZEXT3264(local_5a0);
                            auVar185 = ZEXT3264(local_580);
                            auVar188 = ZEXT3264(local_440);
                            auVar187 = ZEXT3264(local_3e0);
                            auVar186 = ZEXT3264(local_420);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar189 = ZEXT1664(auVar79);
                            pGVar72 = local_5e0;
                            uVar71 = local_560._0_8_;
                          }
                          uVar76 = vptestmd_avx512vl(local_600,local_600);
                          uVar76 = uVar76 & 0xf;
                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar16 = (bool)((byte)uVar76 & 1);
                          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar19 = SUB81(uVar76 >> 3,0);
                          *(uint *)(local_5d0.ray + 0x80) =
                               (uint)bVar16 * auVar79._0_4_ |
                               (uint)!bVar16 * *(int *)(local_5d0.ray + 0x80);
                          *(uint *)(local_5d0.ray + 0x84) =
                               (uint)bVar17 * auVar79._4_4_ |
                               (uint)!bVar17 * *(int *)(local_5d0.ray + 0x84);
                          *(uint *)(local_5d0.ray + 0x88) =
                               (uint)bVar18 * auVar79._8_4_ |
                               (uint)!bVar18 * *(int *)(local_5d0.ray + 0x88);
                          *(uint *)(local_5d0.ray + 0x8c) =
                               (uint)bVar19 * auVar79._12_4_ |
                               (uint)!bVar19 * *(int *)(local_5d0.ray + 0x8c);
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar191 = ZEXT3264(auVar91);
                          auVar190 = ZEXT3264(local_500);
                          auVar193 = ZEXT3264(local_4c0);
                          auVar192 = ZEXT3264(local_4e0);
                          if ((byte)uVar76 != 0) {
                            bVar66 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar178._0_4_;
                        bVar66 = 0;
                        lVar67 = 0;
                        uVar71 = uVar71 ^ 1L << (local_4a0._0_8_ & 0x3f);
                        for (uVar76 = uVar71; (uVar76 & 1) == 0;
                            uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                          lVar67 = lVar67 + 1;
                        }
                      } while (uVar71 != 0);
                    }
                    uVar70 = CONCAT71((int7)(uVar70 >> 8),(byte)uVar70 | bVar66);
                  }
                }
                goto LAB_01dd8217;
              }
            }
            auVar185 = ZEXT3264(local_580);
            auVar184 = ZEXT3264(local_5a0);
          }
LAB_01dd8217:
          lVar74 = lVar74 + 8;
        } while ((int)lVar74 < iVar13);
      }
      bVar75 = (byte)uVar70;
      if ((uVar70 & 1) != 0) break;
      uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar26._4_4_ = uVar133;
      auVar26._0_4_ = uVar133;
      auVar26._8_4_ = uVar133;
      auVar26._12_4_ = uVar133;
      auVar26._16_4_ = uVar133;
      auVar26._20_4_ = uVar133;
      auVar26._24_4_ = uVar133;
      auVar26._28_4_ = uVar133;
      uVar140 = vcmpps_avx512vl(local_80,auVar26,2);
      uVar73 = (uint)uVar68 & (uint)uVar68 + 0xff & (uint)uVar140;
      uVar68 = (ulong)uVar73;
    } while (uVar73 != 0);
  }
  return (bool)(bVar75 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }